

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int handle_handshake_message
              (ptls_t *tls,ptls_buffer_t *sendbuf,ptls_iovec_t message,
              ptls_handshake_properties_t *properties)

{
  anon_struct_16_3_80f1ae39_for_server *paVar1;
  uint *puVar2;
  byte *pbVar3;
  uint8_t uVar4;
  st_ptls_hash_context_t *psVar5;
  st_ptls_encrypt_ticket_t *psVar6;
  _func_int_void_ptr_ptls_iovec_t_ptls_iovec_t *p_Var7;
  st_ptls_lookup_certificate_t *psVar8;
  st_ptls_verify_certificate_t *psVar9;
  st_ptls_save_ticket_t *psVar10;
  ptls_cipher_suite_t *ppVar11;
  st_ptls_key_exchange_context_t *psVar12;
  bool bVar13;
  short sVar14;
  ptls_iovec_t ikm;
  ptls_iovec_t ikm_00;
  uint16_t uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  ushort *puVar24;
  uint8_t *puVar25;
  uint *puVar26;
  st_ptls_key_schedule_t *psVar27;
  ushort *puVar28;
  st_ptls_early_data_receiver_t *psVar29;
  long lVar30;
  uint *puVar31;
  size_t sVar32;
  ushort uVar33;
  ushort uVar34;
  ptls_cipher_suite_t **pppVar36;
  ulong uVar37;
  long lVar38;
  uint *puVar39;
  uint8_t *puVar40;
  ushort *puVar41;
  char *pcVar42;
  undefined1 *puVar43;
  char *context_string;
  size_t mess_start_1;
  ulong uVar44;
  uint *puVar45;
  size_t sVar46;
  ptls_t *ppVar47;
  uint *puVar48;
  ushort *puVar49;
  ulong uVar50;
  ulong *puVar51;
  st_ptls_server_hello_t *psVar52;
  long lVar53;
  ushort *puVar54;
  byte bVar55;
  ulong uVar56;
  size_t sVar57;
  size_t sVar58;
  size_t mess_start;
  size_t *psVar59;
  size_t sVar60;
  ushort uVar61;
  uint8_t *puVar62;
  anon_enum_32 aVar63;
  uint8_t *puVar64;
  bool bVar65;
  bool bVar66;
  ptls_iovec_t salt;
  ptls_iovec_t pVar67;
  ptls_iovec_t pVar68;
  ptls_iovec_t salt_00;
  ptls_iovec_t pVar69;
  ptls_iovec_t ikm_01;
  ptls_iovec_t pVar70;
  ptls_iovec_t pVar71;
  ptls_iovec_t ikm_02;
  ptls_iovec_t ikm_03;
  size_t local_4a8;
  uint *local_4a0;
  size_t local_498;
  size_t local_488;
  uint16_t sign_algorithm;
  ulong local_478;
  ushort local_470;
  uint16_t ticket_csid;
  uint local_46c;
  ulong local_468;
  size_t num_certs;
  ptls_buffer_t decbuf;
  void *signer_data;
  _func_int_void_ptr_ptls_buffer_t_ptr_ptls_iovec_t *signer;
  ptls_iovec_t *certs;
  uint8_t binder_key [64];
  ptls_iovec_t ecdh_secret;
  ptls_iovec_t pubkey;
  uint32_t age_add;
  ptls_iovec_t ticket_server_name;
  ptls_iovec_t ticket_psk;
  uint8_t finished_key [64];
  st_ptls_server_hello_t sh;
  undefined8 local_258;
  undefined8 uStack_250;
  size_t local_248;
  ptls_key_exchange_algorithm_t *local_240;
  ptls_iovec_t local_238 [2];
  uint *local_218;
  ulong local_210 [2];
  uint uStack_200;
  undefined8 uStack_1fc;
  undefined8 local_1f0;
  ulong local_170;
  uint local_168;
  int local_164;
  uint64_t issue_at;
  uint32_t max_early_data_size;
  uint uVar35;
  
  uVar44 = message.len;
  puVar40 = message.base;
  aVar63 = tls->state;
  if (8 < aVar63 - PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO) {
    __assert_fail("!\"unexpected state\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/lib/picotls.c"
                  ,0x860,
                  "int handle_handshake_message(ptls_t *, ptls_buffer_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                 );
  }
  uVar4 = *puVar40;
  switch(aVar63) {
  case PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO:
    if (uVar4 != '\x02') {
      return 10;
    }
    finished_key[0] = '\0';
    finished_key[1] = '\0';
    finished_key[2] = '\0';
    finished_key[3] = '\0';
    finished_key[4] = '\0';
    finished_key[5] = '\0';
    finished_key[6] = '\0';
    finished_key[7] = '\0';
    finished_key[8] = '\0';
    finished_key[9] = '\0';
    finished_key[10] = '\0';
    finished_key[0xb] = '\0';
    finished_key[0xc] = '\0';
    finished_key[0xd] = '\0';
    finished_key[0xe] = '\0';
    finished_key[0xf] = '\0';
    binder_key._0_8_ = puVar40 + 4;
    sh.random[0] = '\0';
    sh.random[1] = '\0';
    sh.random[2] = '\0';
    sh.random[3] = '\0';
    sh.random[4] = '\0';
    sh.random[5] = '\0';
    sh.random[6] = '\0';
    sh.random[7] = '\0';
    sh.random[8] = '\0';
    sh.random[9] = '\0';
    sh.random[10] = '\0';
    sh.random[0xb] = '\0';
    sh.random[0xc] = '\0';
    sh.random[0xd] = '\0';
    sh.random[0xe] = '\0';
    sh.random[0xf] = '\0';
    sh.random[0x10] = '\0';
    sh.random[0x11] = '\0';
    sh.random[0x12] = '\0';
    sh.random[0x13] = '\0';
    sh.random[0x14] = '\0';
    sh.random[0x15] = '\0';
    sh.random[0x16] = '\0';
    sh.random[0x17] = '\0';
    sh.random[0x18] = '\0';
    sh.random[0x19] = '\0';
    sh.random[0x1a] = '\0';
    sh.random[0x1b] = '\0';
    sh.random[0x1c] = '\0';
    sh.random[0x1d] = '\0';
    sh.random[0x1e] = '\0';
    sh.random[0x1f] = '\0';
    sh.peerkey.base = (uint8_t *)0x0;
    sh.peerkey.len = 0;
    uVar21 = 0;
    if ((long)uVar44 < 6) {
      uVar35 = 0x32;
    }
    else {
      binder_key._0_8_ = puVar40 + 6;
      bVar65 = (ushort)(*(ushort *)(puVar40 + 4) << 8 | *(ushort *)(puVar40 + 4) >> 8) == 0x7f12;
      uVar35 = 0x28;
      if (bVar65) {
        uVar35 = uVar21;
      }
      uVar21 = (uint)bVar65;
    }
    if ((char)uVar21 != '\0') {
      puVar25 = puVar40 + uVar44;
      uVar35 = 0x32;
      if (0x1f < (long)puVar25 - binder_key._0_8_) {
        if ((long)puVar25 - (binder_key._0_8_ + 0x20) < 2) {
          uVar35 = 0x32;
          binder_key._0_8_ = binder_key._0_8_ + 0x20;
LAB_0010a2cd:
          bVar65 = false;
        }
        else {
          puVar24 = (ushort *)(binder_key._0_8_ + 0x20);
          binder_key._0_8_ = binder_key._0_8_ + 0x22;
          pppVar36 = tls->ctx->cipher_suites;
          ppVar11 = *pppVar36;
          uVar35 = 0x28;
          if (ppVar11 == (ptls_cipher_suite_t *)0x0) goto LAB_0010a2cd;
          uVar34 = ppVar11->id;
          while (uVar34 != (ushort)(*puVar24 << 8 | *puVar24 >> 8)) {
            pppVar36 = pppVar36 + 1;
            ppVar11 = *pppVar36;
            if (ppVar11 == (ptls_cipher_suite_t *)0x0) goto LAB_0010a2cd;
            uVar34 = ppVar11->id;
          }
          tls->cipher_suite = ppVar11;
          uVar35 = 0;
          bVar65 = true;
        }
        if (bVar65) {
          uVar34 = 0xffff;
          if ((ulong)((long)puVar25 - binder_key._0_8_) < 2) {
            bVar65 = false;
            uVar35 = 0x32;
          }
          else {
            lVar38 = 0;
            uVar23 = 0;
            do {
              uVar23 = (ulong)*(byte *)(binder_key._0_8_ + lVar38) | uVar23 << 8;
              lVar38 = lVar38 + 1;
            } while (lVar38 != 2);
            binder_key._0_8_ = binder_key._0_8_ + 2;
            uVar21 = 0x32;
            if ((ulong)((long)puVar25 - binder_key._0_8_) < uVar23) {
LAB_0010a778:
              uVar35 = uVar21;
              bVar65 = false;
            }
            else {
              bVar65 = true;
              if (uVar23 != 0) {
                lVar38 = uVar23 + binder_key._0_8_;
                uVar34 = 0xffff;
                uVar22 = 0;
                do {
                  uVar21 = 0x32;
                  if (lVar38 - binder_key._0_8_ < 2) goto LAB_0010a778;
                  uVar33 = *(ushort *)binder_key._0_8_;
                  uVar61 = uVar33 << 8 | uVar33 >> 8;
                  lVar30 = binder_key._0_8_ + 2;
                  uVar21 = (uint)uVar61;
                  if (uVar61 < 8) {
                    if ((uVar22 >> (uVar21 & 0x1f) & 1) != 0) {
                      uVar21 = 0x2f;
                      binder_key._0_8_ = lVar30;
                      goto LAB_0010a778;
                    }
                    uVar22 = (uint)(byte)((byte)(1 << ((byte)(uVar33 >> 8) & 0x1f)) & 7 |
                                         (byte)uVar22);
                  }
                  uVar35 = 0x32;
                  bVar66 = true;
                  if (1 < (ulong)(lVar38 - lVar30)) {
                    lVar53 = 0;
                    uVar23 = 0;
                    do {
                      uVar23 = (ulong)*(byte *)(lVar30 + lVar53) | uVar23 << 8;
                      lVar53 = lVar53 + 1;
                    } while (lVar53 != 2);
                    lVar30 = binder_key._0_8_ + 4;
                    if ((uVar23 <= (ulong)(lVar38 - lVar30)) && (uVar61 != 0x2b)) {
                      puVar64 = (uint8_t *)(lVar30 + uVar23);
                      if (uVar21 == 0x29) {
                        uVar35 = 0x32;
                        if (1 < (long)uVar23) {
                          uVar34 = *(ushort *)(binder_key._0_8_ + 4) << 8 |
                                   *(ushort *)(binder_key._0_8_ + 4) >> 8;
                          uVar35 = 0;
                          lVar30 = binder_key._0_8_ + 6;
                        }
                        binder_key._0_8_ = lVar30;
                        uVar21 = 0;
                        lVar30 = binder_key._0_8_;
                        if (1 < (long)uVar23) goto LAB_0010ab7a;
                      }
                      else {
                        if (uVar21 == 0x28) {
                          binder_key._0_8_ = lVar30;
                          uVar21 = decode_key_share_entry
                                             ((uint16_t *)&max_early_data_size,&sh.peerkey,
                                              (uint8_t **)binder_key,puVar64);
                          bVar66 = true;
                          if (uVar21 == 0) {
                            if ((uint8_t *)binder_key._0_8_ != puVar64) {
                              uVar21 = 0x32;
                              goto LAB_0010ab18;
                            }
                            bVar65 = ((tls->field_7).client.key_exchange.algo)->id ==
                                     (uint16_t)max_early_data_size;
                            bVar66 = !bVar65;
                            uVar21 = 0x2f;
                            if (bVar65) {
                              uVar21 = 0;
                            }
                          }
                          else {
LAB_0010ab18:
                            bVar65 = false;
                          }
                          uVar35 = uVar21;
                          lVar30 = binder_key._0_8_;
                          if (!bVar65) goto LAB_0010ab93;
                        }
                        else {
                          uVar21 = 0;
                          binder_key._0_8_ = puVar64;
                        }
LAB_0010ab7a:
                        bVar66 = (uint8_t *)binder_key._0_8_ != puVar64;
                        uVar35 = uVar21;
                        lVar30 = binder_key._0_8_;
                        if (bVar66) {
                          uVar35 = 0x32;
                        }
                      }
                    }
                  }
LAB_0010ab93:
                  binder_key._0_8_ = lVar30;
                  bVar65 = true;
                  uVar21 = uVar35;
                  if (bVar66) goto LAB_0010a778;
                } while (binder_key._0_8_ != lVar38);
              }
            }
          }
          if ((bVar65) && (uVar35 = 0x32, (uint8_t *)binder_key._0_8_ == puVar25)) {
            if (uVar34 != 0xffff) {
              bVar55 = (tls->field_7).client.field_0x20;
              uVar35 = 0x2f;
              if (uVar34 != 0 || (bVar55 & 1) == 0) goto LAB_0010ae88;
              (tls->field_7).client.field_0x20 = bVar55 | 4;
            }
            if ((sh.peerkey.base != (uint8_t *)0x0) ||
               (uVar35 = 0x2f, ((tls->field_7).client.field_0x20 & 4) != 0)) {
              uVar35 = 0;
            }
          }
        }
      }
    }
LAB_0010ae88:
    if (uVar35 != 0) {
      return uVar35;
    }
    if ((sh.peerkey.base != (uint8_t *)0x0) &&
       (psVar12 = (tls->field_7).client.key_exchange.ctx, pVar68.len = sh.peerkey.len,
       pVar68.base = sh.peerkey.base,
       iVar19 = (*psVar12->on_exchange)(psVar12,(ptls_iovec_t *)finished_key,pVar68), iVar19 != 0))
    {
      return iVar19;
    }
    if (((tls->field_7).client.field_0x20 & 5) == 1) {
      psVar27 = tls->key_schedule;
      if (psVar27->generation != 1) {
        __assert_fail("sched->generation == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/lib/picotls.c"
                      ,0x223,"int key_schedule_reset_psk(struct st_ptls_key_schedule_t *)");
      }
      psVar27->secret[0x2c] = '\0';
      psVar27->secret[0x2d] = '\0';
      psVar27->secret[0x2e] = '\0';
      psVar27->secret[0x2f] = '\0';
      psVar27->secret[0x30] = '\0';
      psVar27->secret[0x31] = '\0';
      psVar27->secret[0x32] = '\0';
      psVar27->secret[0x33] = '\0';
      psVar27->secret[0x34] = '\0';
      psVar27->secret[0x35] = '\0';
      psVar27->secret[0x36] = '\0';
      psVar27->secret[0x37] = '\0';
      psVar27->secret[0x38] = '\0';
      psVar27->secret[0x39] = '\0';
      psVar27->secret[0x3a] = '\0';
      psVar27->secret[0x3b] = '\0';
      psVar27->secret[0x1c] = '\0';
      psVar27->secret[0x1d] = '\0';
      psVar27->secret[0x1e] = '\0';
      psVar27->secret[0x1f] = '\0';
      psVar27->secret[0x20] = '\0';
      psVar27->secret[0x21] = '\0';
      psVar27->secret[0x22] = '\0';
      psVar27->secret[0x23] = '\0';
      psVar27->secret[0x24] = '\0';
      psVar27->secret[0x25] = '\0';
      psVar27->secret[0x26] = '\0';
      psVar27->secret[0x27] = '\0';
      psVar27->secret[0x28] = '\0';
      psVar27->secret[0x29] = '\0';
      psVar27->secret[0x2a] = '\0';
      psVar27->secret[0x2b] = '\0';
      psVar27->secret[0xc] = '\0';
      psVar27->secret[0xd] = '\0';
      psVar27->secret[0xe] = '\0';
      psVar27->secret[0xf] = '\0';
      psVar27->secret[0x10] = '\0';
      psVar27->secret[0x11] = '\0';
      psVar27->secret[0x12] = '\0';
      psVar27->secret[0x13] = '\0';
      psVar27->secret[0x14] = '\0';
      psVar27->secret[0x15] = '\0';
      psVar27->secret[0x16] = '\0';
      psVar27->secret[0x17] = '\0';
      psVar27->secret[0x18] = '\0';
      psVar27->secret[0x19] = '\0';
      psVar27->secret[0x1a] = '\0';
      psVar27->secret[0x1b] = '\0';
      psVar27->generation = 0;
      psVar27->secret[0] = '\0';
      psVar27->secret[1] = '\0';
      psVar27->secret[2] = '\0';
      psVar27->secret[3] = '\0';
      psVar27->secret[4] = '\0';
      psVar27->secret[5] = '\0';
      psVar27->secret[6] = '\0';
      psVar27->secret[7] = '\0';
      psVar27->secret[8] = '\0';
      psVar27->secret[9] = '\0';
      psVar27->secret[10] = '\0';
      psVar27->secret[0xb] = '\0';
      psVar27->secret[0x3c] = '\0';
      psVar27->secret[0x3d] = '\0';
      psVar27->secret[0x3e] = '\0';
      psVar27->secret[0x3f] = '\0';
      sVar46 = psVar27->algo->digest_size;
      psVar27->generation = 1;
      salt_00.base = psVar27->secret;
      salt_00.len = sVar46;
      ikm_03.len = sVar46;
      ikm_03.base = zeroes_of_max_digest_size;
      ptls_hkdf_extract(psVar27->algo,salt_00.base,salt_00,ikm_03);
    }
    psVar5 = tls->key_schedule->msghash;
    (*psVar5->update)(psVar5,puVar40,uVar44);
    ikm_00.len._0_1_ = finished_key[8];
    ikm_00.len._1_1_ = finished_key[9];
    ikm_00.len._2_1_ = finished_key[10];
    ikm_00.len._3_1_ = finished_key[0xb];
    ikm_00.len._4_1_ = finished_key[0xc];
    ikm_00.len._5_1_ = finished_key[0xd];
    ikm_00.len._6_1_ = finished_key[0xe];
    ikm_00.len._7_1_ = finished_key[0xf];
    ikm_00.base = (uint8_t *)finished_key._0_8_;
    iVar19 = key_schedule_extract(tls->key_schedule,ikm_00);
    if (iVar19 != 0) {
      return iVar19;
    }
    iVar19 = setup_traffic_protection(tls,tls->cipher_suite,1,"client handshake traffic secret");
    if (iVar19 != 0) {
      return iVar19;
    }
    iVar19 = setup_traffic_protection(tls,tls->cipher_suite,0,"server handshake traffic secret");
    if (iVar19 != 0) {
      return iVar19;
    }
    tls->state = PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS;
    break;
  case PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS:
    if (uVar4 != '\b') {
      return 10;
    }
    puVar24 = (ushort *)(puVar40 + 4);
    iVar19 = 0x32;
    if ((uVar44 & 0xfffffffffffffffe) == 4) {
LAB_0010966b:
      bVar65 = false;
    }
    else {
      lVar38 = 0;
      uVar23 = 0;
      do {
        uVar23 = (ulong)*(byte *)((long)puVar24 + lVar38) | uVar23 << 8;
        lVar38 = lVar38 + 1;
      } while (lVar38 != 2);
      puVar24 = (ushort *)(puVar40 + 6);
      uVar37 = uVar44 - 6;
      if (uVar37 < uVar23) goto LAB_0010966b;
      if (uVar23 == 0) {
        bVar65 = true;
      }
      else {
        puVar41 = (ushort *)(uVar23 + (long)puVar24);
        bVar55 = 0;
        do {
          iVar19 = 0x32;
          puVar49 = puVar24;
          if (1 < (long)puVar41 - (long)puVar24) {
            uVar37 = (ulong)(ushort)(*puVar24 << 8 | *puVar24 >> 8);
            puVar49 = puVar24 + 1;
            iVar19 = 0;
          }
          bVar65 = true;
          if ((long)puVar41 - (long)puVar24 < 2) goto LAB_0010acbb;
          if ((ushort)uVar37 < 8) {
            if ((bVar55 >> ((uint)uVar37 & 0x1f) & 1) != 0) {
              iVar19 = 0x2f;
              goto LAB_0010acbb;
            }
            bVar55 = (byte)(1 << ((byte)uVar37 & 0x1f)) & 7 | bVar55;
          }
          iVar19 = 0x32;
          if ((ulong)((long)puVar41 - (long)puVar49) < 2) {
            bVar66 = false;
            puVar24 = puVar49;
          }
          else {
            lVar38 = 0;
            uVar23 = 0;
            do {
              uVar23 = (ulong)*(byte *)((long)puVar49 + lVar38) | uVar23 << 8;
              lVar38 = lVar38 + 1;
            } while (lVar38 != 2);
            puVar24 = puVar49 + 1;
            if ((ulong)((long)puVar41 - (long)puVar24) < uVar23) {
LAB_00109fb1:
              bVar66 = false;
            }
            else {
              if ((ushort)uVar37 == 0x2a) {
                if (((tls->field_7).client.field_0x20 & 2) == 0) {
LAB_00109fe2:
                  iVar19 = 0x2f;
                  goto LAB_00109fb1;
                }
                if (properties != (ptls_handshake_properties_t *)0x0) {
                  *(byte *)((long)properties + 0x18) = *(byte *)((long)properties + 0x18) | 1;
                }
              }
              else if ((uVar37 & 0xffff) == 0) {
                if (uVar23 != 0) goto LAB_00109fb1;
                if (tls->server_name == (char *)0x0) goto LAB_00109fe2;
              }
              puVar24 = (ushort *)((long)puVar49 + uVar23 + 2);
              bVar66 = true;
              iVar19 = 0;
              bVar65 = false;
            }
          }
          puVar49 = puVar24;
          if (!bVar66) goto LAB_0010acbb;
        } while (puVar24 != puVar41);
        bVar65 = false;
LAB_0010acbb:
        bVar65 = !bVar65;
        puVar24 = puVar49;
      }
    }
    if (!bVar65) {
      return iVar19;
    }
    if (puVar24 != (ushort *)(puVar40 + uVar44)) {
      return 0x32;
    }
    psVar5 = tls->key_schedule->msghash;
    (*psVar5->update)(psVar5,puVar40,uVar44);
    tls->state = (uint)(((tls->field_7).client.field_0x20 & 4) >> 2) * 2 +
                 PTLS_STATE_CLIENT_EXPECT_CERTIFICATE;
    break;
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE:
    if (uVar4 != '\v') {
      return 10;
    }
    if (uVar44 == 4) {
      puVar24 = (ushort *)(puVar40 + 4);
      iVar19 = 0x32;
      bVar65 = false;
    }
    else {
      puVar24 = (ushort *)(puVar40 + 5);
      bVar65 = (ulong)puVar40[4] == 0;
      iVar19 = (uint)(uVar44 - 5 < (ulong)puVar40[4]) * 3 + 0x2f;
    }
    if (!bVar65) {
      return iVar19;
    }
    puVar41 = (ushort *)(puVar40 + uVar44);
    iVar20 = 0x32;
    if ((ulong)((long)puVar41 - (long)puVar24) < 3) {
LAB_00109b51:
      bVar65 = false;
      uVar23 = 0;
    }
    else {
      lVar38 = 0;
      uVar23 = 0;
      do {
        uVar23 = (ulong)*(byte *)((long)puVar24 + lVar38) | uVar23 << 8;
        lVar38 = lVar38 + 1;
      } while (lVar38 != 3);
      puVar24 = (ushort *)((long)puVar24 + 3);
      if ((ulong)((long)puVar41 - (long)puVar24) < uVar23) goto LAB_00109b51;
      puVar49 = (ushort *)(uVar23 + (long)puVar24);
      uVar23 = 0;
      iVar20 = iVar19;
      do {
        bVar65 = true;
        if ((ulong)((long)puVar49 - (long)puVar24) < 3) {
LAB_0010a0f4:
          bVar66 = false;
          iVar20 = 0x32;
        }
        else {
          lVar38 = 0;
          uVar37 = 0;
          do {
            uVar37 = (ulong)*(byte *)((long)puVar24 + lVar38) | uVar37 << 8;
            lVar38 = lVar38 + 1;
          } while (lVar38 != 3);
          puVar28 = (ushort *)((long)puVar24 + 3);
          puVar24 = puVar28;
          if ((ulong)((long)puVar49 - (long)puVar28) < uVar37) goto LAB_0010a0f4;
          puVar24 = (ushort *)((long)puVar28 + uVar37);
          bVar66 = true;
          if (uVar23 < 0x10) {
            *(ushort **)(sh.random + uVar23 * 0x10) = puVar28;
            *(ulong *)(sh.random + uVar23 * 0x10 + 8) = uVar37;
            bVar65 = false;
            uVar23 = uVar23 + 1;
          }
          else {
            bVar65 = false;
          }
        }
        if (!bVar66) goto LAB_0010a7e2;
        bVar66 = true;
        iVar19 = 0x32;
        bVar65 = bVar66;
        if (1 < (ulong)((long)puVar49 - (long)puVar24)) {
          lVar38 = 0;
          uVar37 = 0;
          do {
            uVar37 = (ulong)*(byte *)((long)puVar24 + lVar38) | uVar37 << 8;
            lVar38 = lVar38 + 1;
          } while (lVar38 != 2);
          puVar24 = puVar24 + 1;
          if (uVar37 <= (ulong)((long)puVar49 - (long)puVar24)) {
            if (uVar37 == 0) {
              bVar65 = false;
              iVar19 = iVar20;
            }
            else {
              puVar54 = (ushort *)(uVar37 + (long)puVar24);
              bVar55 = 0;
              puVar28 = puVar24;
              do {
                puVar24 = puVar28;
                iVar19 = 0x32;
                bVar65 = bVar66;
                if ((long)puVar54 - (long)puVar28 < 2) goto LAB_0010a26b;
                uVar34 = *puVar28;
                uVar33 = uVar34 << 8 | uVar34 >> 8;
                puVar24 = puVar28 + 1;
                if (uVar33 < 8) {
                  if ((bVar55 >> (uVar33 & 0x1f) & 1) != 0) {
                    iVar19 = 0x2f;
                    goto LAB_0010a26b;
                  }
                  bVar55 = (byte)(1 << ((byte)(uVar34 >> 8) & 0x1f)) & 7 | bVar55;
                }
                iVar19 = 0x32;
                bVar65 = true;
                if ((ulong)((long)puVar54 - (long)puVar24) < 2) {
                  bVar13 = false;
                }
                else {
                  lVar38 = 0;
                  uVar37 = 0;
                  do {
                    uVar37 = (ulong)*(byte *)((long)puVar24 + lVar38) | uVar37 << 8;
                    lVar38 = lVar38 + 1;
                  } while (lVar38 != 2);
                  puVar24 = puVar28 + 2;
                  bVar13 = uVar37 <= (ulong)((long)puVar54 - (long)puVar24);
                  if (bVar13) {
                    puVar24 = (ushort *)((long)puVar24 + uVar37);
                    iVar19 = 0;
                  }
                  bVar65 = !bVar13;
                }
                if (!bVar13) goto LAB_0010a26b;
                puVar28 = puVar24;
              } while (puVar24 != puVar54);
              bVar65 = false;
            }
          }
        }
LAB_0010a26b:
        iVar20 = iVar19;
        if (bVar65) goto LAB_0010a7e2;
      } while (puVar24 != puVar49);
      bVar65 = false;
LAB_0010a7e2:
      bVar65 = !bVar65;
    }
    if (!bVar65) {
      return iVar20;
    }
    if (puVar24 != puVar41) {
      return 0x32;
    }
    psVar9 = tls->ctx->verify_certificate;
    if ((psVar9 != (st_ptls_verify_certificate_t *)0x0) &&
       (iVar19 = (*psVar9->cb)(psVar9,tls,&(tls->field_7).client.certificate_verify.cb,
                               &(tls->field_7).client.certificate_verify.verify_ctx,
                               (ptls_iovec_t *)&sh,uVar23), iVar19 != 0)) {
      return iVar19;
    }
    psVar5 = tls->key_schedule->msghash;
    (*psVar5->update)(psVar5,puVar40,uVar44);
    tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY;
    break;
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY:
    if (uVar4 != '\x0f') {
      return 10;
    }
    if ((long)uVar44 < 6) {
      return 0x32;
    }
    uVar34 = *(ushort *)(puVar40 + 4) << 8 | *(ushort *)(puVar40 + 4) >> 8;
    puVar25 = puVar40 + 6;
    puVar64 = puVar40 + uVar44;
    iVar19 = 0x32;
    ppVar47 = tls;
    if ((ulong)((long)puVar64 - (long)puVar25) < 2) {
LAB_00109f01:
      pcVar42 = (char *)0x0;
      puVar62 = puVar25;
    }
    else {
      lVar38 = 0;
      ppVar47 = (ptls_t *)0x0;
      do {
        ppVar47 = (ptls_t *)((ulong)puVar25[lVar38] | (long)ppVar47 << 8);
        lVar38 = lVar38 + 1;
      } while (lVar38 != 2);
      puVar62 = puVar40 + 8;
      puVar25 = puVar62;
      if ((ptls_t *)(puVar64 + -(long)puVar62) < ppVar47) goto LAB_00109f01;
      puVar25 = puVar62 + (long)ppVar47;
      pcVar42 = (char *)0x1;
      iVar19 = 0;
    }
    if ((char)pcVar42 == '\0') {
      return iVar19;
    }
    if (puVar25 != puVar64) {
      return 0x32;
    }
    if ((uVar34 != 0x804) && (uVar34 != 0x403)) {
      return 0x2f;
    }
    sVar46 = build_certificate_verify_signdata(sh.random,tls->key_schedule,pcVar42);
    p_Var7 = (tls->field_7).client.certificate_verify.cb;
    if (p_Var7 == (_func_int_void_ptr_ptls_iovec_t_ptls_iovec_t *)0x0) {
      iVar19 = 0;
    }
    else {
      pVar70.len = sVar46;
      pVar70.base = sh.random;
      pVar71.len = (size_t)ppVar47;
      pVar71.base = puVar62;
      iVar19 = (*p_Var7)((tls->field_7).client.certificate_verify.verify_ctx,pVar70,pVar71);
    }
    (*ptls_clear_memory)(&sh,sVar46);
    (tls->field_7).client.certificate_verify.cb =
         (_func_int_void_ptr_ptls_iovec_t_ptls_iovec_t *)0x0;
    if (iVar19 != 0) {
      return iVar19;
    }
    psVar5 = tls->key_schedule->msghash;
    (*psVar5->update)(psVar5,puVar40,uVar44);
    tls->state = PTLS_STATE_CLIENT_EXPECT_FINISHED;
    break;
  case PTLS_STATE_CLIENT_EXPECT_FINISHED:
    if (uVar4 != '\x14') {
      return 10;
    }
    iVar20 = verify_finished(tls,message);
    if (iVar20 == 0) {
      psVar5 = tls->key_schedule->msghash;
      (*psVar5->update)(psVar5,puVar40,uVar44);
      psVar27 = tls->key_schedule;
      sVar46 = psVar27->algo->digest_size;
      psVar27->generation = psVar27->generation + 1;
      salt.base = psVar27->secret;
      salt.len = sVar46;
      ikm_02.len = sVar46;
      ikm_02.base = zeroes_of_max_digest_size;
      iVar20 = ptls_hkdf_extract(psVar27->algo,salt.base,salt,ikm_02);
      if (((iVar20 == 0) &&
          (iVar20 = setup_traffic_protection
                              (tls,tls->cipher_suite,0,"server application traffic secret"),
          iVar20 == 0)) &&
         (iVar20 = derive_secret(tls->key_schedule,&sh,"client application traffic secret"),
         iVar20 == 0)) {
        send_finished(tls,sendbuf);
        *(undefined8 *)((tls->traffic_protection).enc.secret + 0x30) = local_258;
        *(undefined8 *)((tls->traffic_protection).enc.secret + 0x38) = uStack_250;
        *(uint8_t **)((tls->traffic_protection).enc.secret + 0x20) = sh.peerkey.base;
        *(size_t *)((tls->traffic_protection).enc.secret + 0x28) = sh.peerkey.len;
        *(undefined8 *)((tls->traffic_protection).enc.secret + 0x10) = sh.random._16_8_;
        *(undefined8 *)((tls->traffic_protection).enc.secret + 0x18) = sh.random._24_8_;
        *(undefined8 *)(tls->traffic_protection).enc.secret = sh.random._0_8_;
        *(undefined8 *)((tls->traffic_protection).enc.secret + 8) = sh.random._8_8_;
        iVar20 = setup_traffic_protection(tls,tls->cipher_suite,1,(char *)0x0);
        if (iVar20 == 0) {
          tls->state = PTLS_STATE_CLIENT_POST_HANDSHAKE;
          iVar20 = 0;
        }
      }
    }
    psVar52 = &sh;
    goto LAB_00109c4c;
  case PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO:
    if (uVar4 != '\x01') {
      return 0x28;
    }
    certs = (ptls_iovec_t *)0x0;
    num_certs = 0;
    sign_algorithm = 0;
    signer = (_func_int_void_ptr_ptls_buffer_t_ptr_ptls_iovec_t *)0x0;
    signer_data = (void *)0x0;
    pubkey.base = (uint8_t *)0x0;
    pubkey.len = 0;
    ecdh_secret.base = (uint8_t *)0x0;
    ecdh_secret.len = 0;
    if (tls->key_schedule != (st_ptls_key_schedule_t *)0x0) {
      __assert_fail("tls->key_schedule == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/lib/picotls.c"
                    ,0x69c,"int server_handle_hello(ptls_t *, ptls_buffer_t *, ptls_iovec_t)");
    }
    bVar65 = false;
    memset(&sh,0,0x128);
    if ((long)uVar44 < 6) {
      puVar25 = puVar40 + 4;
      iVar19 = 0x32;
    }
    else {
      puVar25 = puVar40 + 6;
      bVar65 = (ushort)(*(ushort *)(puVar40 + 4) << 8 | *(ushort *)(puVar40 + 4) >> 8) == 0x303;
      iVar19 = 0x28;
      if (bVar65) {
        iVar19 = 0;
      }
    }
    puVar2 = (uint *)(puVar40 + uVar44);
    iVar20 = iVar19;
    if ((bVar65) && (iVar20 = 0x32, 0x1f < (long)puVar2 - (long)puVar25)) {
      puVar26 = (uint *)(puVar25 + 0x20);
      iVar20 = 0x32;
      if (puVar26 == puVar2) {
        bVar65 = false;
        iVar20 = 0x32;
      }
      else {
        bVar55 = puVar25[0x20];
        puVar26 = (uint *)(puVar25 + 0x21);
        if ((ulong)((long)puVar2 - (long)puVar26) < (ulong)bVar55) {
          bVar65 = false;
        }
        else {
          bVar65 = bVar55 < 0x21;
          uVar23 = 0;
          if (bVar65) {
            uVar23 = (ulong)bVar55;
          }
          iVar20 = 0x32;
          if (bVar65) {
            iVar20 = iVar19;
          }
          puVar26 = (uint *)((long)puVar26 + uVar23);
        }
      }
      if (bVar65) {
        iVar20 = 0x32;
        if ((ulong)((long)puVar2 - (long)puVar26) < 2) {
LAB_0010a737:
          bVar65 = false;
        }
        else {
          lVar38 = 0;
          uVar23 = 0;
          do {
            uVar23 = (ulong)*(byte *)((long)puVar26 + lVar38) | uVar23 << 8;
            lVar38 = lVar38 + 1;
          } while (lVar38 != 2);
          puVar26 = (uint *)((long)puVar26 + 2);
          uVar37 = (long)puVar2 - (long)puVar26;
          if (uVar37 < uVar23) goto LAB_0010a737;
          puVar45 = (uint *)(uVar23 + (long)puVar26);
          do {
            lVar38 = (long)puVar45 - (long)puVar26;
            iVar20 = 0x32;
            if (1 < lVar38) {
              uVar37 = (ulong)(ushort)((ushort)*puVar26 << 8 | (ushort)*puVar26 >> 8);
              puVar26 = (uint *)((long)puVar26 + 2);
              iVar20 = 0;
            }
            bVar65 = true;
            if (1 < lVar38) {
              bVar65 = false;
              if (tls->cipher_suite == (ptls_cipher_suite_t *)0x0) {
                pppVar36 = tls->ctx->cipher_suites;
                ppVar11 = *pppVar36;
                while (ppVar11 != (ptls_cipher_suite_t *)0x0) {
                  pppVar36 = pppVar36 + 1;
                  if (ppVar11->id == (uint16_t)uVar37) {
                    tls->cipher_suite = ppVar11;
                    bVar65 = false;
                    break;
                  }
                  ppVar11 = *pppVar36;
                }
              }
            }
            if (lVar38 < 2) goto LAB_0010acf2;
          } while (puVar26 != puVar45);
          bVar65 = false;
LAB_0010acf2:
          bVar65 = !bVar65;
        }
        if (bVar65) {
          if (tls->cipher_suite == (ptls_cipher_suite_t *)0x0) {
            iVar20 = 0x28;
          }
          else {
            iVar19 = 0x32;
            if (puVar26 == puVar2) {
              bVar65 = false;
              local_4a0 = puVar26;
            }
            else {
              puVar45 = (uint *)((long)puVar26 + 1);
              uVar23 = (ulong)(byte)*puVar26;
              local_4a0 = puVar45;
              if ((ulong)((long)puVar2 - (long)puVar45) < uVar23) {
                bVar65 = false;
              }
              else {
                bVar65 = uVar23 != 0;
                if (bVar65) {
                  local_4a0 = (uint *)((long)puVar26 + uVar23 + 1);
                  sh.random._8_8_ = (long)local_4a0 - (long)puVar45;
                  bVar65 = true;
                  iVar19 = iVar20;
                  sh.random._0_8_ = puVar45;
                }
              }
            }
            iVar20 = iVar19;
            if (bVar65) {
              if ((ulong)((long)puVar2 - (long)local_4a0) < 2) {
LAB_0010adb4:
                bVar65 = false;
                uVar37 = 0;
                iVar19 = 0x32;
              }
              else {
                lVar38 = 0;
                uVar23 = 0;
                do {
                  uVar23 = (ulong)*(byte *)((long)local_4a0 + lVar38) | uVar23 << 8;
                  lVar38 = lVar38 + 1;
                } while (lVar38 != 2);
                local_4a0 = (uint *)((long)local_4a0 + 2);
                if ((ulong)((long)puVar2 - (long)local_4a0) < uVar23) goto LAB_0010adb4;
                uVar37 = (ulong)(uVar23 == 0);
                if (uVar23 == 0) {
                  bVar65 = false;
                }
                else {
                  puVar45 = (uint *)(uVar23 + (long)local_4a0);
                  uVar37 = 0;
                  local_46c = (uint)&tls->server_name;
                  uVar21 = 0;
                  uVar35 = 0;
                  puVar26 = local_4a0;
LAB_0010afe7:
                  uVar34 = (ushort)uVar35;
                  if ((long)puVar45 - (long)puVar26 < 2) {
                    iVar19 = 0x32;
                    local_4a0 = puVar26;
                    goto LAB_0010b818;
                  }
                  uVar33 = (ushort)*puVar26;
                  uVar34 = uVar33 << 8 | uVar33 >> 8;
                  uVar35 = (uint)uVar34;
                  puVar48 = (uint *)((long)puVar26 + 2);
                  local_4a0 = puVar48;
                  if (7 < uVar34) {
LAB_0010b03b:
                    iVar19 = 0x32;
                    if ((ulong)((long)puVar45 - (long)puVar48) < 2) {
                      bVar65 = false;
                      goto LAB_0010b683;
                    }
                    lVar38 = 0;
                    uVar23 = 0;
                    do {
                      uVar56 = uVar23 * 0x100;
                      pbVar3 = (byte *)((long)puVar48 + lVar38);
                      uVar23 = uVar56 + *pbVar3;
                      lVar38 = lVar38 + 1;
                    } while (lVar38 != 2);
                    local_4a0 = puVar26 + 1;
                    iVar19 = 0x32;
                    if ((ulong)((long)puVar45 - (long)local_4a0) < uVar23) goto LAB_0010b089;
                    puVar48 = (uint *)((long)puVar48 + uVar23 + 2);
                    if (uVar35 < 0x28) {
                      if (uVar35 == 0) {
                        local_478 = uVar37;
                        iVar19 = client_hello_decode_server_name
                                           (&tls->server_name,(uint8_t *)local_4a0,
                                            (uint8_t *)puVar48);
                      }
                      else {
                        if (uVar35 != 10) {
                          local_478 = uVar37;
                          if (uVar35 == 0xd) {
                            iVar19 = 0x32;
                            if ((ulong)((long)puVar48 - (long)local_4a0) < 2) {
                              bVar65 = false;
                            }
                            else {
                              lVar38 = 0;
                              uVar23 = 0;
                              do {
                                uVar23 = (ulong)*(byte *)((long)local_4a0 + lVar38) | uVar23 << 8;
                                lVar38 = lVar38 + 1;
                              } while (lVar38 != 2);
                              local_4a0 = (uint *)((long)puVar26 + 6);
                              if ((ulong)((long)puVar48 - (long)local_4a0) < uVar23) {
                                bVar65 = false;
                              }
                              else {
                                puVar26 = (uint *)(uVar23 + (long)local_4a0);
                                sVar46 = local_248;
                                do {
                                  lVar38 = (long)puVar26 - (long)local_4a0;
                                  iVar19 = 0x32;
                                  if (1 < lVar38) {
                                    local_470 = (ushort)*local_4a0 << 8 | (ushort)*local_4a0 >> 8;
                                    local_4a0 = (uint *)((long)local_4a0 + 2);
                                    iVar19 = 0;
                                  }
                                  bVar65 = true;
                                  uVar23 = sVar46;
                                  if ((1 < lVar38) && (bVar65 = false, sVar46 < 0x10)) {
                                    uVar23 = sVar46 + 1;
                                    *(ushort *)(sh.random + sVar46 * 2 + 0x20) = local_470;
                                    local_248 = uVar23;
                                  }
                                  if (lVar38 < 2) goto LAB_0010b41f;
                                  sVar46 = uVar23;
                                } while (local_4a0 != puVar26);
                                bVar65 = false;
LAB_0010b41f:
                                bVar65 = !bVar65;
                              }
                            }
                            if (bVar65) {
                              if (local_4a0 == puVar48) goto LAB_0010b67e;
                              iVar19 = 0x32;
                            }
                            goto LAB_0010b089;
                          }
                          goto switchD_0010b0c6_default;
                        }
                        local_478 = uVar37;
                        iVar19 = client_hello_select_negotiated_group
                                           ((ptls_key_exchange_algorithm_t **)(sh.random + 0x18),
                                            tls->ctx->key_exchanges,(uint8_t *)local_4a0,
                                            (uint8_t *)puVar48);
                      }
LAB_0010b189:
                      uVar37 = local_478;
                      if (iVar19 != 0) {
LAB_0010b1a3:
                        bVar65 = false;
                        goto LAB_0010b683;
                      }
                      goto switchD_0010b0c6_default;
                    }
                    switch(uVar35) {
                    case 0x28:
                      local_478 = uVar37;
                      iVar19 = client_hello_decode_key_share
                                         (&local_240,local_238,tls->ctx->key_exchanges,
                                          (uint8_t *)local_4a0,(uint8_t *)puVar48);
                      goto LAB_0010b189;
                    case 0x29:
                      iVar20 = 0x32;
                      if ((ulong)((long)puVar48 - (long)local_4a0) < 2) {
                        local_468 = 0;
                        bVar65 = false;
                      }
                      else {
                        lVar38 = 0;
                        uVar23 = 0;
                        do {
                          uVar23 = (ulong)*(byte *)((long)local_4a0 + lVar38) | uVar23 << 8;
                          lVar38 = lVar38 + 1;
                        } while (lVar38 != 2);
                        local_4a0 = (uint *)((long)puVar26 + 6);
                        local_468 = 0;
                        if ((ulong)((long)puVar48 - (long)local_4a0) < uVar23) {
                          bVar65 = false;
                        }
                        else {
                          puVar26 = (uint *)(uVar23 + (long)local_4a0);
                          iVar20 = 0;
                          uVar23 = local_170;
                          do {
                            bVar65 = true;
                            lVar38 = 0;
                            if ((ulong)((long)puVar26 - (long)local_4a0) < 2) {
LAB_0010b4a1:
                              uVar56 = 0;
                              bVar66 = false;
                              puVar39 = (uint *)0x0;
                              iVar20 = 0x32;
                            }
                            else {
                              uVar56 = 0;
                              do {
                                uVar56 = (ulong)*(byte *)((long)local_4a0 + lVar38) | uVar56 << 8;
                                lVar38 = lVar38 + 1;
                              } while (lVar38 != 2);
                              local_4a0 = (uint *)((long)local_4a0 + 2);
                              if ((ulong)((long)puVar26 - (long)local_4a0) < uVar56)
                              goto LAB_0010b4a1;
                              bVar66 = true;
                              bVar65 = false;
                              puVar39 = local_4a0;
                              local_4a0 = (uint *)((long)local_4a0 + uVar56);
                            }
                            if (bVar66) {
                              lVar38 = (long)puVar26 - (long)local_4a0;
                              if (lVar38 < 4) {
                                iVar20 = 0x32;
                                uVar22 = 0;
                              }
                              else {
                                uVar22 = *local_4a0;
                                uVar22 = uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 |
                                         (uVar22 & 0xff00) << 8 | uVar22 << 0x18;
                                local_4a0 = local_4a0 + 1;
                                iVar20 = 0;
                              }
                              bVar65 = true;
                              if (3 < lVar38) {
                                uVar50 = uVar23;
                                if (uVar23 < 4) {
                                  uVar50 = uVar23 + 1;
                                  local_210[uVar23 * 5] = (ulong)puVar39;
                                  local_210[uVar23 * 5 + 1] = uVar56;
                                  (&uStack_200)[uVar23 * 10] = uVar22;
                                  (&uStack_1fc)[uVar23 * 5] = 0;
                                  *(undefined8 *)(&stack0xfffffffffffffe0c + uVar23 * 0x28) = 0;
                                  local_170 = uVar50;
                                  *(undefined4 *)((long)&local_1f0 + uVar23 * 0x28 + 4) = 0;
                                }
                                local_468 = local_468 + 1;
                                bVar65 = false;
                                iVar20 = 0;
                                uVar23 = uVar50;
                              }
                            }
                            bVar65 = !bVar65;
                          } while ((bVar65) && (local_4a0 != puVar26));
                        }
                      }
                      uVar23 = local_170;
                      puVar26 = local_4a0;
                      if (bVar65) {
                        iVar19 = 0x32;
                        if ((ulong)((long)puVar48 - (long)local_4a0) < 2) {
LAB_0010b5a0:
                          bVar65 = false;
                        }
                        else {
                          lVar38 = 0;
                          uVar56 = 0;
                          do {
                            uVar56 = (ulong)*(byte *)((long)local_4a0 + lVar38) | uVar56 << 8;
                            lVar38 = lVar38 + 1;
                          } while (lVar38 != 2);
                          puVar26 = (uint *)((long)local_4a0 + 2);
                          if ((ulong)((long)puVar48 - (long)puVar26) < uVar56) goto LAB_0010b5a0;
                          puVar39 = (uint *)(uVar56 + (long)puVar26);
                          puVar51 = &local_1f0;
                          uVar56 = 0;
                          do {
                            if (puVar39 == puVar26) {
LAB_0010b603:
                              bVar65 = false;
                              iVar20 = 0x32;
                            }
                            else {
                              uVar50 = (ulong)(byte)*puVar26;
                              puVar31 = (uint *)((long)puVar26 + 1);
                              puVar26 = puVar31;
                              if ((ulong)((long)puVar39 - (long)puVar31) < uVar50)
                              goto LAB_0010b603;
                              puVar26 = (uint *)((long)puVar31 + uVar50);
                              bVar65 = true;
                              if (uVar56 < uVar23) {
                                puVar51[-1] = (ulong)puVar31;
                                *puVar51 = uVar50;
                              }
                            }
                            if (!bVar65) goto LAB_0010b632;
                            uVar56 = uVar56 + 1;
                            puVar51 = puVar51 + 5;
                          } while (puVar26 != puVar39);
                          bVar65 = local_468 == uVar56;
                          if (!bVar65) {
                            iVar20 = 0x2f;
                          }
LAB_0010b632:
                          iVar19 = 0x32;
                          if (puVar26 == puVar39) {
                            iVar19 = iVar20;
                          }
                          if (!bVar65) {
                            iVar19 = iVar20;
                          }
                          bVar65 = (bool)(puVar26 == puVar39 & bVar65);
                        }
                        local_218 = local_4a0;
                        if (bVar65) {
                          bVar65 = puVar26 == puVar48;
                          if (!bVar65) {
                            iVar19 = 0x32;
                          }
                        }
                        else {
                          bVar65 = false;
                        }
                      }
                      else {
                        bVar65 = false;
                        iVar19 = iVar20;
                      }
                      local_4a0 = puVar26;
                      local_478 = uVar37;
                      if (!bVar65) goto LAB_0010b089;
                      goto LAB_0010b67e;
                    case 0x2a:
                      local_164 = 1;
                    default:
switchD_0010b0c6_default:
                      iVar19 = 0;
LAB_0010b67e:
                      bVar65 = true;
                      local_4a0 = puVar48;
                      break;
                    case 0x2b:
                      iVar19 = 0x32;
                      if (uVar23 == 0) {
                        bVar65 = false;
                      }
                      else {
                        local_4a0 = (uint *)((long)puVar26 + 5);
                        if ((ulong)((long)puVar48 - (long)local_4a0) < (ulong)(byte)puVar26[1]) {
                          bVar65 = false;
                        }
                        else {
                          puVar26 = (uint *)((ulong)(byte)puVar26[1] + (long)local_4a0);
                          uVar22 = (uint)(ushort)sh.random._16_2_;
                          do {
                            lVar38 = (long)puVar26 - (long)local_4a0;
                            iVar19 = 0x32;
                            if (1 < lVar38) {
                              local_46c = (uint)(ushort)((ushort)*local_4a0 << 8 |
                                                        (ushort)*local_4a0 >> 8);
                              local_4a0 = (uint *)((long)local_4a0 + 2);
                              iVar19 = 0;
                            }
                            bVar65 = true;
                            if (1 < lVar38) {
                              sVar14 = (short)local_46c;
                              bVar65 = false;
                              if (sVar14 == 0x7f12 && (short)uVar22 == 0) {
                                sh.random[0x10] = (char)sVar14;
                                sh.random[0x11] = (char)((ushort)sVar14 >> 8);
                                uVar22 = local_46c;
                              }
                            }
                            if (lVar38 < 2) goto LAB_0010b382;
                          } while (local_4a0 != puVar26);
                          bVar65 = false;
LAB_0010b382:
                          bVar65 = !bVar65;
                        }
                      }
                      if (bVar65) {
                        if (local_4a0 == puVar48) goto LAB_0010b67e;
                        iVar19 = 0x32;
                      }
                      goto LAB_0010b089;
                    case 0x2c:
                      if (uVar23 == 0) goto switchD_0010b0c6_default;
                      iVar19 = 0x2f;
                      goto LAB_0010b1a3;
                    case 0x2d:
                      if (uVar23 != 0) {
                        uVar23 = 0;
                        uVar22 = local_168;
                        do {
                          if (*(byte *)((long)local_4a0 + uVar23) < 0x20) {
                            uVar22 = uVar22 | 1 << (*(byte *)((long)local_4a0 + uVar23) & 0x1f);
                            local_168 = uVar22;
                          }
                          uVar23 = uVar23 + 1;
                        } while ((uVar56 | *pbVar3) != uVar23);
                        iVar19 = 0;
                        goto LAB_0010b67e;
                      }
LAB_0010b089:
                      bVar65 = false;
                    }
LAB_0010b683:
                    if ((!bVar65) ||
                       (uVar37 = CONCAT71((int7)(uVar37 >> 8),local_4a0 == puVar45),
                       puVar26 = local_4a0, local_4a0 == puVar45)) goto LAB_0010b818;
                    goto LAB_0010afe7;
                  }
                  if ((uVar21 >> (uVar35 & 0x1f) & 1) == 0) {
                    uVar21 = (uint)(byte)((byte)(1 << ((byte)(uVar33 >> 8) & 0x1f)) & 7 |
                                         (byte)uVar21);
                    goto LAB_0010b03b;
                  }
                  iVar19 = 0x2f;
LAB_0010b818:
                  bVar65 = uVar34 == 0x29;
                }
              }
              iVar20 = iVar19;
              if (((uVar37 & 1) != 0) && (iVar20 = 0x32, local_4a0 == puVar2)) {
                iVar20 = 0x46;
                if (sh.random._16_2_ == 0x7f12) {
                  iVar20 = 0x2f;
                  if ((((sh.random._8_8_ == 1) && (iVar20 = 0x2f, *(char *)sh.random._0_8_ == '\0'))
                      && (iVar20 = 0x6d, sh.random._24_8_ != 0)) &&
                     ((local_248 != 0 && (local_240 != (ptls_key_exchange_algorithm_t *)0x0)))) {
                    if (local_218 == (uint *)0x0) {
                      iVar20 = 0x2f;
                      if (local_164 == 0 && local_168 == 0) goto LAB_0010ba34;
                    }
                    else {
                      iVar20 = 0x2f;
                      if (bVar65) {
LAB_0010ba34:
                        iVar20 = 0;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if (iVar20 == 0) {
      psVar27 = key_schedule_new(tls->cipher_suite->hash);
      tls->key_schedule = psVar27;
      if (tls->ctx->require_dhe_on_psk != 0) {
        local_168 = local_168 & 0xfffffffe;
      }
      if (((local_218 == (uint *)0x0) || ((local_168 & 3) == 0)) ||
         (tls->ctx->decrypt_ticket == (ptls_encrypt_ticket_t *)0x0)) {
        (*psVar27->msghash->update)(psVar27->msghash,puVar40,uVar44);
        local_4a0 = (uint *)0xffffffffffffffff;
      }
      else {
        (*psVar27->msghash->update)(psVar27->msghash,puVar40,(long)local_218 - (long)puVar40);
        decbuf.base = finished_key;
        decbuf.off = 0;
        decbuf.capacity = 0x100;
        decbuf._24_8_ = decbuf._24_8_ & 0xffffffff00000000;
        local_4a0 = (uint *)0xffffffffffffffff;
        if (local_170 != 0) {
          psVar59 = &local_1f0;
          uVar44 = 0;
          do {
            decbuf.off = 0;
            psVar6 = tls->ctx->decrypt_ticket;
            iVar19 = (*psVar6->cb)(psVar6,tls,&decbuf,*(ptls_iovec_t *)(psVar59 + -4));
            if ((iVar19 == 0) &&
               (iVar19 = decode_session_identifier
                                   (&issue_at,&ticket_psk,&age_add,&ticket_server_name,&ticket_csid,
                                    decbuf.base,decbuf.base + decbuf.off),
               sVar46 = ticket_server_name.len, iVar19 == 0)) {
              pcVar42 = tls->server_name;
              if (ticket_server_name.len == 0) {
                if (pcVar42 == (char *)0x0) goto LAB_00109dd0;
              }
              else if (((pcVar42 != (char *)0x0) &&
                       (iVar19 = strncmp(pcVar42,(char *)ticket_server_name.base,
                                         ticket_server_name.len), iVar19 == 0)) &&
                      (pcVar42[sVar46] == '\0')) {
LAB_00109dd0:
                if (ticket_csid == tls->cipher_suite->id) {
                  sVar46 = tls->key_schedule->algo->digest_size;
                  if ((ticket_psk.len == sVar46) && (*psVar59 == sVar46)) {
                    ikm_01.len = ticket_psk.len;
                    ikm_01.base = ticket_psk.base;
                    iVar20 = key_schedule_extract(tls->key_schedule,ikm_01);
                    local_4a0 = (uint *)uVar44;
                    if ((iVar20 == 0) &&
                       ((iVar20 = derive_secret(tls->key_schedule,binder_key,
                                                "resumption psk binder key"), iVar20 == 0 &&
                        (iVar20 = calc_verify_data(&max_early_data_size,tls->key_schedule,binder_key
                                                  ), iVar20 == 0)))) {
                      iVar19 = bcmp((void *)psVar59[-1],&max_early_data_size,
                                    tls->key_schedule->algo->digest_size);
                      iVar20 = 0x33;
                      if (iVar19 == 0) {
                        iVar20 = 0;
                      }
                    }
                    goto LAB_0010a643;
                  }
                }
              }
            }
            uVar44 = uVar44 + 1;
            psVar59 = psVar59 + 5;
          } while (uVar44 < local_170);
        }
        iVar20 = 0;
LAB_0010a643:
        (*ptls_clear_memory)(decbuf.base,decbuf.off);
        if (decbuf.is_allocated != 0) {
          free(decbuf.base);
        }
        decbuf.off = 0;
        decbuf.is_allocated = 0;
        decbuf._28_4_ = 0;
        decbuf.base = (uint8_t *)0x0;
        decbuf.capacity = 0;
        (*ptls_clear_memory)(binder_key,0x40);
        (*ptls_clear_memory)(&max_early_data_size,0x40);
        if (iVar20 != 0) goto LAB_00109c23;
        psVar5 = tls->key_schedule->msghash;
        (*psVar5->update)(psVar5,local_218,(long)puVar2 - (long)local_218);
      }
      if (local_4a0 == (uint *)0xffffffffffffffff) {
        key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
        bVar65 = true;
      }
      else if ((local_168 & 1) == 0) {
        bVar65 = true;
        if ((local_168 & 2) == 0) {
          __assert_fail("(ch.psk.ke_modes & (1u << PTLS_PSK_KE_MODE_PSK_DHE)) != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/lib/picotls.c"
                        ,0x6b9,"int server_handle_hello(ptls_t *, ptls_buffer_t *, ptls_iovec_t)");
        }
      }
      else {
        bVar65 = false;
      }
      if (((local_164 == 0) || (local_4a0 != (uint *)0x0)) || (tls->ctx->max_early_data_size == 0))
      {
LAB_0010a36c:
        if ((bool)(local_240 == &key_exchange_no_match & bVar65)) {
          if (sh.random._24_8_ == 0) {
            iVar20 = 0x28;
          }
          else {
            iVar20 = ptls_buffer_reserve(sendbuf,3);
            if (iVar20 == 0) {
              puVar25 = sendbuf->base;
              sVar46 = sendbuf->off;
              puVar40 = puVar25 + sVar46;
              puVar40[0] = '\x16';
              puVar40[1] = '\x03';
              puVar25[sVar46 + 2] = '\x01';
              sendbuf->off = sendbuf->off + 3;
              iVar20 = 0;
            }
            if (iVar20 == 0) {
              iVar20 = ptls_buffer_reserve(sendbuf,2);
              if (iVar20 == 0) {
                puVar40 = sendbuf->base;
                sVar46 = sendbuf->off;
                (puVar40 + sVar46)[0] = '\0';
                (puVar40 + sVar46)[1] = '\0';
                sendbuf->off = sendbuf->off + 2;
                iVar20 = 0;
              }
              bVar65 = true;
              if (iVar20 == 0) {
                sVar46 = sendbuf->off;
                iVar20 = ptls_buffer_reserve(sendbuf,1);
                if (iVar20 == 0) {
                  sendbuf->base[sendbuf->off] = '\x06';
                  sendbuf->off = sendbuf->off + 1;
                  iVar20 = 0;
                }
                bVar65 = true;
                if (iVar20 == 0) {
                  iVar20 = ptls_buffer_reserve(sendbuf,3);
                  if (iVar20 == 0) {
                    puVar40 = sendbuf->base;
                    sVar57 = sendbuf->off;
                    puVar40[sVar57 + 2] = '\0';
                    puVar40 = puVar40 + sVar57;
                    puVar40[0] = '\0';
                    puVar40[1] = '\0';
                    sendbuf->off = sendbuf->off + 3;
                    iVar20 = 0;
                  }
                  if (iVar20 == 0) {
                    sVar57 = sendbuf->off;
                    iVar20 = ptls_buffer_reserve(sendbuf,2);
                    if (iVar20 == 0) {
                      puVar40 = sendbuf->base;
                      sVar60 = sendbuf->off;
                      (puVar40 + sVar60)[0] = '\x7f';
                      (puVar40 + sVar60)[1] = '\x12';
                      sendbuf->off = sendbuf->off + 2;
                      iVar20 = 0;
                    }
                    bVar65 = iVar20 != 0;
                    if (iVar20 == 0) {
                      iVar20 = ptls_buffer_reserve(sendbuf,2);
                      if (iVar20 == 0) {
                        puVar40 = sendbuf->base;
                        sVar60 = sendbuf->off;
                        (puVar40 + sVar60)[0] = '\0';
                        (puVar40 + sVar60)[1] = '\0';
                        sendbuf->off = sendbuf->off + 2;
                        iVar20 = 0;
                      }
                      bVar65 = true;
                      if (iVar20 == 0) {
                        local_4a8 = sendbuf->off;
                        iVar20 = ptls_buffer_reserve(sendbuf,2);
                        if (iVar20 == 0) {
                          puVar40 = sendbuf->base;
                          sVar60 = sendbuf->off;
                          (puVar40 + sVar60)[0] = '\0';
                          (puVar40 + sVar60)[1] = '(';
                          sendbuf->off = sendbuf->off + 2;
                          iVar20 = 0;
                        }
                        bVar65 = iVar20 != 0;
                        if (iVar20 == 0) {
                          iVar20 = ptls_buffer_reserve(sendbuf,2);
                          if (iVar20 == 0) {
                            puVar40 = sendbuf->base;
                            sVar60 = sendbuf->off;
                            (puVar40 + sVar60)[0] = '\0';
                            (puVar40 + sVar60)[1] = '\0';
                            sendbuf->off = sendbuf->off + 2;
                            iVar20 = 0;
                          }
                          bVar65 = true;
                          if (iVar20 == 0) {
                            sVar60 = sendbuf->off;
                            uVar34 = *(ushort *)sh.random._24_8_;
                            iVar20 = ptls_buffer_reserve(sendbuf,2);
                            if (iVar20 == 0) {
                              *(ushort *)(sendbuf->base + sendbuf->off) = uVar34 << 8 | uVar34 >> 8;
                              sendbuf->off = sendbuf->off + 2;
                              iVar20 = 0;
                            }
                            bVar65 = iVar20 != 0;
                            if (iVar20 == 0) {
                              uVar44 = sendbuf->off - sVar60;
                              lVar38 = 8;
                              do {
                                sendbuf->base[sVar60 - 2] =
                                     (uint8_t)(uVar44 >> ((byte)lVar38 & 0x3f));
                                lVar38 = lVar38 + -8;
                                sVar60 = sVar60 + 1;
                              } while (lVar38 != -8);
                              bVar65 = false;
                            }
                          }
                          if (!bVar65) {
                            iVar20 = ptls_buffer_reserve(sendbuf,2);
                            if (iVar20 == 0) {
                              puVar40 = sendbuf->base;
                              sVar60 = sendbuf->off;
                              (puVar40 + sVar60)[0] = '\0';
                              (puVar40 + sVar60)[1] = '\r';
                              sendbuf->off = sendbuf->off + 2;
                              iVar20 = 0;
                            }
                            bVar65 = iVar20 != 0;
                            if (!bVar65) {
                              iVar20 = ptls_buffer_reserve(sendbuf,2);
                              if (iVar20 == 0) {
                                puVar40 = sendbuf->base;
                                sVar60 = sendbuf->off;
                                (puVar40 + sVar60)[0] = '\0';
                                (puVar40 + sVar60)[1] = '\0';
                                sendbuf->off = sendbuf->off + 2;
                                iVar20 = 0;
                              }
                              bVar65 = true;
                              if (iVar20 == 0) {
                                sVar60 = sendbuf->off;
                                lVar38 = -2;
                                do {
                                  sendbuf->base[lVar38 + sVar60] = '\0';
                                  lVar38 = lVar38 + 1;
                                } while (lVar38 != 0);
                                bVar65 = false;
                              }
                              if (iVar20 == 0) {
                                uVar44 = sendbuf->off - local_4a8;
                                lVar38 = 8;
                                bVar65 = false;
                                do {
                                  sendbuf->base[local_4a8 - 2] =
                                       (uint8_t)(uVar44 >> ((byte)lVar38 & 0x3f));
                                  lVar38 = lVar38 + -8;
                                  local_4a8 = local_4a8 + 1;
                                } while (lVar38 != -8);
                              }
                            }
                          }
                        }
                      }
                      if (!bVar65) {
                        uVar44 = sendbuf->off - sVar57;
                        lVar38 = 0x10;
                        bVar65 = false;
                        do {
                          sendbuf->base[sVar57 - 3] = (uint8_t)(uVar44 >> ((byte)lVar38 & 0x3f));
                          lVar38 = lVar38 + -8;
                          sVar57 = sVar57 + 1;
                        } while (lVar38 != -8);
                      }
                    }
                  }
                }
                if (!bVar65) {
                  uVar44 = sendbuf->off - sVar46;
                  lVar38 = 8;
                  do {
                    sendbuf->base[sVar46 - 2] = (uint8_t)(uVar44 >> ((byte)lVar38 & 0x3f));
                    lVar38 = lVar38 + -8;
                    sVar46 = sVar46 + 1;
                  } while (lVar38 != -8);
                  bVar65 = false;
                }
              }
              if (!bVar65) {
                if (bVar65) {
                  return iVar20;
                }
                iVar20 = 0x202;
              }
            }
          }
        }
        else {
          if (local_4a0 == (uint *)0xffffffffffffffff) {
            psVar8 = tls->ctx->lookup_certificate;
            iVar20 = (*psVar8->cb)(psVar8,tls,&sign_algorithm,&signer,&signer_data,&certs,&num_certs
                                   ,tls->server_name,(uint16_t *)&sh.peerkey,local_248);
            if (iVar20 != 0) goto LAB_00109c23;
            if (sign_algorithm == 0) {
              __assert_fail("sign_algorithm != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/lib/picotls.c"
                            ,0x6e4,
                            "int server_handle_hello(ptls_t *, ptls_buffer_t *, ptls_iovec_t)");
            }
          }
          if ((!bVar65) ||
             (iVar20 = (*local_240->exchange)(&pubkey,&ecdh_secret,local_238[0]), iVar20 == 0)) {
            iVar20 = ptls_buffer_reserve(sendbuf,3);
            if (iVar20 == 0) {
              puVar25 = sendbuf->base;
              sVar46 = sendbuf->off;
              puVar40 = puVar25 + sVar46;
              puVar40[0] = '\x16';
              puVar40[1] = '\x03';
              puVar25[sVar46 + 2] = '\x01';
              sendbuf->off = sendbuf->off + 3;
              iVar20 = 0;
            }
            if (iVar20 == 0) {
              iVar20 = ptls_buffer_reserve(sendbuf,2);
              if (iVar20 == 0) {
                puVar40 = sendbuf->base;
                sVar46 = sendbuf->off;
                (puVar40 + sVar46)[0] = '\0';
                (puVar40 + sVar46)[1] = '\0';
                sendbuf->off = sendbuf->off + 2;
                iVar20 = 0;
              }
              bVar66 = true;
              if (iVar20 == 0) {
                sVar46 = sendbuf->off;
                iVar20 = ptls_buffer_reserve(sendbuf,1);
                if (iVar20 == 0) {
                  sendbuf->base[sendbuf->off] = '\x02';
                  sendbuf->off = sendbuf->off + 1;
                  iVar20 = 0;
                }
                bVar66 = true;
                if (iVar20 == 0) {
                  iVar20 = ptls_buffer_reserve(sendbuf,3);
                  if (iVar20 == 0) {
                    puVar40 = sendbuf->base;
                    sVar57 = sendbuf->off;
                    puVar40[sVar57 + 2] = '\0';
                    puVar40 = puVar40 + sVar57;
                    puVar40[0] = '\0';
                    puVar40[1] = '\0';
                    sendbuf->off = sendbuf->off + 3;
                    iVar20 = 0;
                  }
                  bVar66 = true;
                  if (iVar20 == 0) {
                    local_498 = sendbuf->off;
                    iVar20 = ptls_buffer_reserve(sendbuf,2);
                    if (iVar20 == 0) {
                      puVar40 = sendbuf->base;
                      sVar57 = sendbuf->off;
                      (puVar40 + sVar57)[0] = '\x7f';
                      (puVar40 + sVar57)[1] = '\x12';
                      sendbuf->off = sendbuf->off + 2;
                      iVar20 = 0;
                    }
                    bVar66 = iVar20 != 0;
                    if ((iVar20 == 0) &&
                       (iVar20 = ptls_buffer_reserve(sendbuf,0x20), bVar66 = true, iVar20 == 0)) {
                      (*tls->ctx->random_bytes)(sendbuf->base + sendbuf->off,0x20);
                      sendbuf->off = sendbuf->off + 0x20;
                      uVar34 = tls->cipher_suite->id;
                      iVar20 = ptls_buffer_reserve(sendbuf,2);
                      if (iVar20 == 0) {
                        *(ushort *)(sendbuf->base + sendbuf->off) = uVar34 << 8 | uVar34 >> 8;
                        sendbuf->off = sendbuf->off + 2;
                        iVar20 = 0;
                      }
                      bVar66 = iVar20 != 0;
                      if (iVar20 == 0) {
                        iVar20 = ptls_buffer_reserve(sendbuf,2);
                        if (iVar20 == 0) {
                          puVar40 = sendbuf->base;
                          sVar57 = sendbuf->off;
                          (puVar40 + sVar57)[0] = '\0';
                          (puVar40 + sVar57)[1] = '\0';
                          sendbuf->off = sendbuf->off + 2;
                          iVar20 = 0;
                        }
                        bVar66 = true;
                        if (iVar20 == 0) {
                          sVar57 = sendbuf->off;
                          iVar20 = 0;
                          if (bVar65) {
                            iVar20 = ptls_buffer_reserve(sendbuf,2);
                            if (iVar20 == 0) {
                              puVar40 = sendbuf->base;
                              sVar60 = sendbuf->off;
                              (puVar40 + sVar60)[0] = '\0';
                              (puVar40 + sVar60)[1] = '(';
                              sendbuf->off = sendbuf->off + 2;
                              iVar20 = 0;
                            }
                            bVar66 = iVar20 != 0;
                            if (bVar66) goto LAB_0010bdc7;
                            iVar20 = ptls_buffer_reserve(sendbuf,2);
                            if (iVar20 == 0) {
                              puVar40 = sendbuf->base;
                              sVar60 = sendbuf->off;
                              (puVar40 + sVar60)[0] = '\0';
                              (puVar40 + sVar60)[1] = '\0';
                              sendbuf->off = sendbuf->off + 2;
                              iVar20 = 0;
                            }
                            bVar66 = true;
                            if (iVar20 == 0) {
                              sVar60 = sendbuf->off;
                              uVar34 = local_240->id;
                              iVar20 = ptls_buffer_reserve(sendbuf,2);
                              if (iVar20 == 0) {
                                *(ushort *)(sendbuf->base + sendbuf->off) =
                                     uVar34 << 8 | uVar34 >> 8;
                                sendbuf->off = sendbuf->off + 2;
                                iVar20 = 0;
                              }
                              bVar66 = iVar20 != 0;
                              if (iVar20 == 0) {
                                iVar20 = ptls_buffer_reserve(sendbuf,2);
                                if (iVar20 == 0) {
                                  puVar40 = sendbuf->base;
                                  sVar58 = sendbuf->off;
                                  (puVar40 + sVar58)[0] = '\0';
                                  (puVar40 + sVar58)[1] = '\0';
                                  sendbuf->off = sendbuf->off + 2;
                                  iVar20 = 0;
                                }
                                bVar66 = true;
                                if (iVar20 == 0) {
                                  local_488 = sendbuf->off;
                                  iVar20 = ptls_buffer__do_pushv(sendbuf,pubkey.base,pubkey.len);
                                  if (iVar20 != 0) goto LAB_0010bc72;
                                  uVar44 = sendbuf->off - local_488;
                                  lVar38 = 8;
                                  do {
                                    sendbuf->base[local_488 - 2] =
                                         (uint8_t)(uVar44 >> ((byte)lVar38 & 0x3f));
                                    lVar38 = lVar38 + -8;
                                    local_488 = local_488 + 1;
                                  } while (lVar38 != -8);
                                  bVar66 = false;
                                  bVar65 = true;
                                }
                                else {
LAB_0010bc72:
                                  bVar65 = false;
                                }
                                if (bVar65) {
                                  uVar44 = sendbuf->off - sVar60;
                                  lVar38 = 8;
                                  do {
                                    sendbuf->base[sVar60 - 2] =
                                         (uint8_t)(uVar44 >> ((byte)lVar38 & 0x3f));
                                    lVar38 = lVar38 + -8;
                                    sVar60 = sVar60 + 1;
                                  } while (lVar38 != -8);
                                  bVar66 = false;
                                }
                              }
                            }
                            if (bVar66) goto LAB_0010bdc7;
                          }
                          if (local_4a0 == (uint *)0xffffffffffffffff) {
LAB_0010bd9e:
                            uVar44 = sendbuf->off - sVar57;
                            lVar38 = 8;
                            do {
                              sendbuf->base[sVar57 - 2] = (uint8_t)(uVar44 >> ((byte)lVar38 & 0x3f))
                              ;
                              lVar38 = lVar38 + -8;
                              sVar57 = sVar57 + 1;
                            } while (lVar38 != -8);
                            bVar66 = false;
                          }
                          else {
                            iVar20 = ptls_buffer_reserve(sendbuf,2);
                            if (iVar20 == 0) {
                              puVar40 = sendbuf->base;
                              sVar60 = sendbuf->off;
                              (puVar40 + sVar60)[0] = '\0';
                              (puVar40 + sVar60)[1] = ')';
                              sendbuf->off = sendbuf->off + 2;
                              iVar20 = 0;
                            }
                            bVar66 = iVar20 != 0;
                            if (!bVar66) {
                              iVar20 = ptls_buffer_reserve(sendbuf,2);
                              if (iVar20 == 0) {
                                puVar40 = sendbuf->base;
                                sVar60 = sendbuf->off;
                                (puVar40 + sVar60)[0] = '\0';
                                (puVar40 + sVar60)[1] = '\0';
                                sendbuf->off = sendbuf->off + 2;
                                iVar20 = 0;
                              }
                              bVar66 = true;
                              if (iVar20 == 0) {
                                sVar60 = sendbuf->off;
                                iVar20 = ptls_buffer_reserve(sendbuf,2);
                                if (iVar20 == 0) {
                                  *(ushort *)(sendbuf->base + sendbuf->off) =
                                       (ushort)local_4a0 << 8 | (ushort)local_4a0 >> 8;
                                  sendbuf->off = sendbuf->off + 2;
                                  iVar20 = 0;
                                }
                                bVar66 = iVar20 != 0;
                                if (iVar20 == 0) {
                                  uVar44 = sendbuf->off - sVar60;
                                  lVar38 = 8;
                                  do {
                                    sendbuf->base[sVar60 - 2] =
                                         (uint8_t)(uVar44 >> ((byte)lVar38 & 0x3f));
                                    lVar38 = lVar38 + -8;
                                    sVar60 = sVar60 + 1;
                                  } while (lVar38 != -8);
                                  bVar66 = false;
                                }
                              }
                              if (!bVar66) goto LAB_0010bd9e;
                            }
                          }
                        }
LAB_0010bdc7:
                        if (!bVar66) {
                          uVar44 = sendbuf->off - local_498;
                          lVar38 = 0x10;
                          bVar66 = false;
                          do {
                            sendbuf->base[local_498 - 3] =
                                 (uint8_t)(uVar44 >> ((byte)lVar38 & 0x3f));
                            lVar38 = lVar38 + -8;
                            local_498 = local_498 + 1;
                          } while (lVar38 != -8);
                        }
                      }
                    }
                  }
                  if (!bVar66) {
                    bVar66 = false;
                    if (tls->key_schedule != (st_ptls_key_schedule_t *)0x0) {
                      psVar5 = tls->key_schedule->msghash;
                      (*psVar5->update)(psVar5,sendbuf->base + sVar46,sendbuf->off - sVar46);
                    }
                  }
                }
                if (!bVar66) {
                  uVar44 = sendbuf->off - sVar46;
                  lVar38 = 8;
                  do {
                    sendbuf->base[sVar46 - 2] = (uint8_t)(uVar44 >> ((byte)lVar38 & 0x3f));
                    lVar38 = lVar38 + -8;
                    sVar46 = sVar46 + 1;
                  } while (lVar38 != -8);
                  bVar66 = false;
                }
              }
              if (!bVar66) {
                if (bVar66) {
                  return iVar20;
                }
                ikm.len = ecdh_secret.len;
                ikm.base = ecdh_secret.base;
                key_schedule_extract(tls->key_schedule,ikm);
                iVar20 = setup_traffic_protection
                                   (tls,tls->cipher_suite,1,"server handshake traffic secret");
                if (iVar20 == 0) {
                  psVar29 = (tls->field_7).server.early_data;
                  if (psVar29 == (st_ptls_early_data_receiver_t *)0x0) {
                    iVar20 = setup_traffic_protection
                                       (tls,tls->cipher_suite,0,"client handshake traffic secret");
                    if (iVar20 == 0) {
                      if (local_164 != 0) {
                        paVar1 = &(tls->field_7).server;
                        *(byte *)paVar1 = *(byte *)paVar1 | 2;
                      }
                      goto LAB_0010bf06;
                    }
                  }
                  else {
                    iVar20 = derive_secret(tls->key_schedule,psVar29,
                                           "client handshake traffic secret");
                    if (iVar20 == 0) {
LAB_0010bf06:
                      sVar46 = sendbuf->off;
                      iVar20 = ptls_buffer_reserve(sendbuf,3);
                      if (iVar20 == 0) {
                        puVar25 = sendbuf->base;
                        sVar57 = sendbuf->off;
                        puVar40 = puVar25 + sVar57;
                        puVar40[0] = '\x16';
                        puVar40[1] = '\x03';
                        puVar25[sVar57 + 2] = '\x01';
                        sendbuf->off = sendbuf->off + 3;
                        iVar20 = 0;
                      }
                      bVar65 = true;
                      if (iVar20 == 0) {
                        iVar20 = ptls_buffer_reserve(sendbuf,2);
                        if (iVar20 == 0) {
                          puVar40 = sendbuf->base;
                          sVar57 = sendbuf->off;
                          (puVar40 + sVar57)[0] = '\0';
                          (puVar40 + sVar57)[1] = '\0';
                          sendbuf->off = sendbuf->off + 2;
                          iVar20 = 0;
                        }
                        bVar65 = true;
                        if (iVar20 == 0) {
                          sVar57 = sendbuf->off;
                          iVar20 = ptls_buffer_reserve(sendbuf,1);
                          if (iVar20 == 0) {
                            sendbuf->base[sendbuf->off] = '\b';
                            sendbuf->off = sendbuf->off + 1;
                            iVar20 = 0;
                          }
                          bVar65 = true;
                          if (iVar20 == 0) {
                            iVar20 = ptls_buffer_reserve(sendbuf,3);
                            if (iVar20 == 0) {
                              puVar40 = sendbuf->base;
                              sVar60 = sendbuf->off;
                              puVar40[sVar60 + 2] = '\0';
                              puVar40 = puVar40 + sVar60;
                              puVar40[0] = '\0';
                              puVar40[1] = '\0';
                              sendbuf->off = sendbuf->off + 3;
                              iVar20 = 0;
                            }
                            bVar65 = true;
                            if (iVar20 == 0) {
                              sVar60 = sendbuf->off;
                              iVar20 = ptls_buffer_reserve(sendbuf,2);
                              if (iVar20 == 0) {
                                puVar40 = sendbuf->base;
                                sVar58 = sendbuf->off;
                                (puVar40 + sVar58)[0] = '\0';
                                (puVar40 + sVar58)[1] = '\0';
                                sendbuf->off = sendbuf->off + 2;
                                iVar20 = 0;
                              }
                              bVar65 = true;
                              if (iVar20 == 0) {
                                local_498 = sendbuf->off;
                                if (tls->server_name == (char *)0x0) {
                                  iVar20 = 0;
LAB_0010c0e3:
                                  if (((tls->field_7).server.early_data ==
                                       (st_ptls_early_data_receiver_t *)0x0) ||
                                     ((tls->traffic_protection).dec.aead ==
                                      (ptls_aead_context_t *)0x0)) {
LAB_0010c19c:
                                    uVar44 = sendbuf->off - local_498;
                                    lVar38 = 8;
                                    do {
                                      sendbuf->base[local_498 - 2] =
                                           (uint8_t)(uVar44 >> ((byte)lVar38 & 0x3f));
                                      lVar38 = lVar38 + -8;
                                      local_498 = local_498 + 1;
                                    } while (lVar38 != -8);
                                    bVar65 = false;
                                  }
                                  else {
                                    iVar20 = ptls_buffer_reserve(sendbuf,2);
                                    if (iVar20 == 0) {
                                      puVar40 = sendbuf->base;
                                      sVar58 = sendbuf->off;
                                      (puVar40 + sVar58)[0] = '\0';
                                      (puVar40 + sVar58)[1] = '*';
                                      sendbuf->off = sendbuf->off + 2;
                                      iVar20 = 0;
                                    }
                                    bVar65 = iVar20 != 0;
                                    if (!bVar65) {
                                      iVar20 = ptls_buffer_reserve(sendbuf,2);
                                      if (iVar20 == 0) {
                                        puVar40 = sendbuf->base;
                                        sVar58 = sendbuf->off;
                                        (puVar40 + sVar58)[0] = '\0';
                                        (puVar40 + sVar58)[1] = '\0';
                                        sendbuf->off = sendbuf->off + 2;
                                        iVar20 = 0;
                                      }
                                      bVar65 = true;
                                      if (iVar20 == 0) {
                                        sVar58 = sendbuf->off;
                                        lVar38 = -2;
                                        do {
                                          sendbuf->base[lVar38 + sVar58] = '\0';
                                          lVar38 = lVar38 + 1;
                                        } while (lVar38 != 0);
                                        bVar65 = false;
                                      }
                                      if (iVar20 == 0) goto LAB_0010c19c;
                                    }
                                  }
                                }
                                else {
                                  iVar20 = ptls_buffer_reserve(sendbuf,2);
                                  if (iVar20 == 0) {
                                    puVar40 = sendbuf->base;
                                    sVar58 = sendbuf->off;
                                    (puVar40 + sVar58)[0] = '\0';
                                    (puVar40 + sVar58)[1] = '\0';
                                    sendbuf->off = sendbuf->off + 2;
                                    iVar20 = 0;
                                  }
                                  bVar65 = iVar20 != 0;
                                  if (!bVar65) {
                                    iVar20 = ptls_buffer_reserve(sendbuf,2);
                                    if (iVar20 == 0) {
                                      puVar40 = sendbuf->base;
                                      sVar58 = sendbuf->off;
                                      (puVar40 + sVar58)[0] = '\0';
                                      (puVar40 + sVar58)[1] = '\0';
                                      sendbuf->off = sendbuf->off + 2;
                                      iVar20 = 0;
                                    }
                                    bVar65 = true;
                                    if (iVar20 == 0) {
                                      sVar58 = sendbuf->off;
                                      lVar38 = -2;
                                      do {
                                        sendbuf->base[lVar38 + sVar58] = '\0';
                                        lVar38 = lVar38 + 1;
                                      } while (lVar38 != 0);
                                      bVar65 = false;
                                    }
                                    if (iVar20 == 0) goto LAB_0010c0e3;
                                  }
                                }
                              }
                              if (!bVar65) {
                                uVar44 = sendbuf->off - sVar60;
                                lVar38 = 0x10;
                                do {
                                  sendbuf->base[sVar60 - 3] =
                                       (uint8_t)(uVar44 >> ((byte)lVar38 & 0x3f));
                                  lVar38 = lVar38 + -8;
                                  sVar60 = sVar60 + 1;
                                } while (lVar38 != -8);
                                bVar65 = false;
                              }
                            }
                            if (!bVar65) {
                              bVar65 = false;
                              if (tls->key_schedule != (st_ptls_key_schedule_t *)0x0) {
                                psVar5 = tls->key_schedule->msghash;
                                (*psVar5->update)(psVar5,sendbuf->base + sVar57,
                                                  sendbuf->off - sVar57);
                              }
                            }
                          }
                          if (!bVar65) {
                            uVar44 = sendbuf->off - sVar57;
                            lVar38 = 8;
                            do {
                              sendbuf->base[sVar57 - 2] = (uint8_t)(uVar44 >> ((byte)lVar38 & 0x3f))
                              ;
                              lVar38 = lVar38 + -8;
                              sVar57 = sVar57 + 1;
                            } while (lVar38 != -8);
                            bVar65 = false;
                          }
                        }
                        if (!bVar65) {
                          iVar20 = buffer_encrypt_record
                                             (sendbuf,sVar46,(tls->traffic_protection).enc.aead);
                          bVar65 = iVar20 != 0;
                        }
                      }
                      if (!bVar65) {
                        if (bVar65) {
                          return iVar20;
                        }
                        if (local_4a0 == (uint *)0xffffffffffffffff) {
                          sVar46 = sendbuf->off;
                          iVar20 = ptls_buffer_reserve(sendbuf,3);
                          if (iVar20 == 0) {
                            puVar25 = sendbuf->base;
                            sVar57 = sendbuf->off;
                            puVar40 = puVar25 + sVar57;
                            puVar40[0] = '\x16';
                            puVar40[1] = '\x03';
                            puVar25[sVar57 + 2] = '\x01';
                            sendbuf->off = sendbuf->off + 3;
                            iVar20 = 0;
                          }
                          bVar65 = true;
                          if (iVar20 == 0) {
                            iVar20 = ptls_buffer_reserve(sendbuf,2);
                            if (iVar20 == 0) {
                              puVar40 = sendbuf->base;
                              sVar57 = sendbuf->off;
                              (puVar40 + sVar57)[0] = '\0';
                              (puVar40 + sVar57)[1] = '\0';
                              sendbuf->off = sendbuf->off + 2;
                              iVar20 = 0;
                            }
                            bVar65 = true;
                            if (iVar20 == 0) {
                              sVar57 = sendbuf->off;
                              iVar20 = ptls_buffer_reserve(sendbuf,1);
                              if (iVar20 == 0) {
                                sendbuf->base[sendbuf->off] = '\v';
                                sendbuf->off = sendbuf->off + 1;
                                iVar20 = 0;
                              }
                              bVar65 = true;
                              if (iVar20 == 0) {
                                iVar20 = ptls_buffer_reserve(sendbuf,3);
                                if (iVar20 == 0) {
                                  puVar40 = sendbuf->base;
                                  sVar60 = sendbuf->off;
                                  puVar40[sVar60 + 2] = '\0';
                                  puVar40 = puVar40 + sVar60;
                                  puVar40[0] = '\0';
                                  puVar40[1] = '\0';
                                  sendbuf->off = sendbuf->off + 3;
                                  iVar20 = 0;
                                }
                                bVar65 = true;
                                if (iVar20 == 0) {
                                  local_498 = sendbuf->off;
                                  iVar20 = ptls_buffer_reserve(sendbuf,1);
                                  if (iVar20 == 0) {
                                    sendbuf->base[sendbuf->off] = '\0';
                                    sendbuf->off = sendbuf->off + 1;
                                    iVar20 = 0;
                                  }
                                  if (iVar20 == 0) {
                                    iVar20 = ptls_buffer_reserve(sendbuf,3);
                                    if (iVar20 == 0) {
                                      puVar40 = sendbuf->base;
                                      sVar60 = sendbuf->off;
                                      puVar40[sVar60 + 2] = '\0';
                                      puVar40 = puVar40 + sVar60;
                                      puVar40[0] = '\0';
                                      puVar40[1] = '\0';
                                      sendbuf->off = sendbuf->off + 3;
                                      iVar20 = 0;
                                    }
                                    bVar65 = true;
                                    if (iVar20 == 0) {
                                      local_4a0 = (uint *)sendbuf->off;
                                      if (num_certs == 0) {
                                        bVar65 = false;
                                        iVar20 = 0;
                                      }
                                      else {
                                        local_488 = 0;
                                        do {
                                          iVar20 = ptls_buffer_reserve(sendbuf,3);
                                          if (iVar20 == 0) {
                                            puVar40 = sendbuf->base;
                                            sVar60 = sendbuf->off;
                                            puVar40[sVar60 + 2] = '\0';
                                            puVar40 = puVar40 + sVar60;
                                            puVar40[0] = '\0';
                                            puVar40[1] = '\0';
                                            sendbuf->off = sendbuf->off + 3;
                                            iVar20 = 0;
                                          }
                                          bVar65 = true;
                                          if (iVar20 == 0) {
                                            sVar60 = sendbuf->off;
                                            iVar20 = ptls_buffer__do_pushv
                                                               (sendbuf,certs[local_488].base,
                                                                certs[local_488].len);
                                            if (iVar20 != 0) goto LAB_0010c4d8;
                                            uVar44 = sendbuf->off - sVar60;
                                            lVar38 = 0x10;
                                            do {
                                              sendbuf->base[sVar60 - 3] =
                                                   (uint8_t)(uVar44 >> ((byte)lVar38 & 0x3f));
                                              lVar38 = lVar38 + -8;
                                              sVar60 = sVar60 + 1;
                                            } while (lVar38 != -8);
                                            bVar65 = false;
                                            bVar66 = true;
                                          }
                                          else {
LAB_0010c4d8:
                                            bVar66 = false;
                                          }
                                          if (!bVar66) goto LAB_0010c5eb;
                                          iVar20 = ptls_buffer_reserve(sendbuf,2);
                                          if (iVar20 == 0) {
                                            puVar40 = sendbuf->base;
                                            sVar60 = sendbuf->off;
                                            (puVar40 + sVar60)[0] = '\0';
                                            (puVar40 + sVar60)[1] = '\0';
                                            sendbuf->off = sendbuf->off + 2;
                                            iVar20 = 0;
                                          }
                                          bVar65 = true;
                                          if (iVar20 == 0) {
                                            sVar60 = sendbuf->off;
                                            lVar38 = -2;
                                            do {
                                              sendbuf->base[lVar38 + sVar60] = '\0';
                                              lVar38 = lVar38 + 1;
                                            } while (lVar38 != 0);
                                            bVar65 = false;
                                          }
                                          if (iVar20 != 0) goto LAB_0010c5eb;
                                          local_488 = local_488 + 1;
                                        } while (local_488 != num_certs);
                                        bVar65 = false;
                                      }
LAB_0010c5eb:
                                      if (!bVar65) {
                                        uVar44 = sendbuf->off - (long)local_4a0;
                                        lVar38 = 0x10;
                                        do {
                                          sendbuf->base[(long)local_4a0 - 3] =
                                               (uint8_t)(uVar44 >> ((byte)lVar38 & 0x3f));
                                          lVar38 = lVar38 + -8;
                                          local_4a0 = (uint *)((long)local_4a0 + 1);
                                        } while (lVar38 != -8);
                                        bVar65 = false;
                                      }
                                    }
                                    if (!bVar65) {
                                      uVar44 = sendbuf->off - local_498;
                                      lVar38 = 0x10;
                                      do {
                                        sendbuf->base[local_498 - 3] =
                                             (uint8_t)(uVar44 >> ((byte)lVar38 & 0x3f));
                                        lVar38 = lVar38 + -8;
                                        local_498 = local_498 + 1;
                                      } while (lVar38 != -8);
                                      bVar65 = false;
                                    }
                                  }
                                }
                                if (!bVar65) {
                                  bVar65 = false;
                                  if (tls->key_schedule != (st_ptls_key_schedule_t *)0x0) {
                                    psVar5 = tls->key_schedule->msghash;
                                    (*psVar5->update)(psVar5,sendbuf->base + sVar57,
                                                      sendbuf->off - sVar57);
                                  }
                                }
                              }
                              if (!bVar65) {
                                uVar44 = sendbuf->off - sVar57;
                                lVar38 = 8;
                                do {
                                  sendbuf->base[sVar57 - 2] =
                                       (uint8_t)(uVar44 >> ((byte)lVar38 & 0x3f));
                                  lVar38 = lVar38 + -8;
                                  sVar57 = sVar57 + 1;
                                } while (lVar38 != -8);
                                bVar65 = false;
                              }
                            }
                            if (!bVar65) {
                              iVar20 = buffer_encrypt_record
                                                 (sendbuf,sVar46,(tls->traffic_protection).enc.aead)
                              ;
                              bVar65 = iVar20 != 0;
                            }
                          }
                          if (!bVar65) {
                            if (bVar65) {
                              return iVar20;
                            }
                            sVar46 = sendbuf->off;
                            iVar20 = ptls_buffer_reserve(sendbuf,3);
                            if (iVar20 == 0) {
                              puVar25 = sendbuf->base;
                              sVar57 = sendbuf->off;
                              puVar40 = puVar25 + sVar57;
                              puVar40[0] = '\x16';
                              puVar40[1] = '\x03';
                              puVar25[sVar57 + 2] = '\x01';
                              sendbuf->off = sendbuf->off + 3;
                              iVar20 = 0;
                            }
                            bVar65 = true;
                            if (iVar20 == 0) {
                              iVar20 = ptls_buffer_reserve(sendbuf,2);
                              if (iVar20 == 0) {
                                puVar40 = sendbuf->base;
                                sVar57 = sendbuf->off;
                                (puVar40 + sVar57)[0] = '\0';
                                (puVar40 + sVar57)[1] = '\0';
                                sendbuf->off = sendbuf->off + 2;
                                iVar20 = 0;
                              }
                              bVar65 = true;
                              if (iVar20 == 0) {
                                sVar57 = sendbuf->off;
                                iVar20 = ptls_buffer_reserve(sendbuf,1);
                                if (iVar20 == 0) {
                                  sendbuf->base[sendbuf->off] = '\x0f';
                                  sendbuf->off = sendbuf->off + 1;
                                  iVar20 = 0;
                                }
                                bVar65 = true;
                                if (iVar20 == 0) {
                                  iVar20 = ptls_buffer_reserve(sendbuf,3);
                                  uVar15 = sign_algorithm;
                                  if (iVar20 == 0) {
                                    puVar40 = sendbuf->base;
                                    sVar60 = sendbuf->off;
                                    puVar40[sVar60 + 2] = '\0';
                                    puVar40 = puVar40 + sVar60;
                                    puVar40[0] = '\0';
                                    puVar40[1] = '\0';
                                    sendbuf->off = sendbuf->off + 3;
                                    iVar20 = 0;
                                  }
                                  bVar65 = true;
                                  if (iVar20 == 0) {
                                    sVar60 = sendbuf->off;
                                    iVar20 = ptls_buffer_reserve(sendbuf,2);
                                    if (iVar20 == 0) {
                                      *(uint16_t *)(sendbuf->base + sendbuf->off) =
                                           uVar15 << 8 | uVar15 >> 8;
                                      sendbuf->off = sendbuf->off + 2;
                                      iVar20 = 0;
                                    }
                                    bVar65 = iVar20 != 0;
                                    if (iVar20 == 0) {
                                      iVar20 = ptls_buffer_reserve(sendbuf,2);
                                      if (iVar20 == 0) {
                                        puVar40 = sendbuf->base;
                                        sVar58 = sendbuf->off;
                                        (puVar40 + sVar58)[0] = '\0';
                                        (puVar40 + sVar58)[1] = '\0';
                                        sendbuf->off = sendbuf->off + 2;
                                        iVar20 = 0;
                                      }
                                      bVar65 = true;
                                      if (iVar20 == 0) {
                                        sVar58 = sendbuf->off;
                                        sVar32 = build_certificate_verify_signdata
                                                           (finished_key,tls->key_schedule,
                                                            context_string);
                                        pVar69.len = sVar32;
                                        pVar69.base = finished_key;
                                        iVar20 = (*signer)(signer_data,sendbuf,pVar69);
                                        bVar65 = iVar20 != 0;
                                        if (iVar20 == 0) {
                                          uVar44 = sendbuf->off - sVar58;
                                          lVar38 = 8;
                                          do {
                                            sendbuf->base[sVar58 - 2] =
                                                 (uint8_t)(uVar44 >> ((byte)lVar38 & 0x3f));
                                            lVar38 = lVar38 + -8;
                                            sVar58 = sVar58 + 1;
                                          } while (lVar38 != -8);
                                          bVar65 = false;
                                        }
                                      }
                                      if (!bVar65) {
                                        uVar44 = sendbuf->off - sVar60;
                                        lVar38 = 0x10;
                                        do {
                                          sendbuf->base[sVar60 - 3] =
                                               (uint8_t)(uVar44 >> ((byte)lVar38 & 0x3f));
                                          lVar38 = lVar38 + -8;
                                          sVar60 = sVar60 + 1;
                                        } while (lVar38 != -8);
                                        bVar65 = false;
                                      }
                                    }
                                  }
                                  if (!bVar65) {
                                    bVar65 = false;
                                    if (tls->key_schedule != (st_ptls_key_schedule_t *)0x0) {
                                      psVar5 = tls->key_schedule->msghash;
                                      (*psVar5->update)(psVar5,sendbuf->base + sVar57,
                                                        sendbuf->off - sVar57);
                                    }
                                  }
                                }
                                if (!bVar65) {
                                  uVar44 = sendbuf->off - sVar57;
                                  lVar38 = 8;
                                  do {
                                    sendbuf->base[sVar57 - 2] =
                                         (uint8_t)(uVar44 >> ((byte)lVar38 & 0x3f));
                                    lVar38 = lVar38 + -8;
                                    sVar57 = sVar57 + 1;
                                  } while (lVar38 != -8);
                                  bVar65 = false;
                                }
                              }
                              if (!bVar65) {
                                iVar20 = buffer_encrypt_record
                                                   (sendbuf,sVar46,
                                                    (tls->traffic_protection).enc.aead);
                                bVar65 = iVar20 != 0;
                              }
                            }
                            if (!bVar65) {
                              if (bVar65) {
                                return iVar20;
                              }
                              goto LAB_0010c29b;
                            }
                          }
                        }
                        else {
LAB_0010c29b:
                          send_finished(tls,sendbuf);
                          iVar19 = key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
                          if (iVar19 != 0) {
                            return iVar19;
                          }
                          iVar19 = setup_traffic_protection
                                             (tls,tls->cipher_suite,1,
                                              "server application traffic secret");
                          if (iVar19 != 0) {
                            return iVar19;
                          }
                          tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
                          iVar20 = 0;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        psVar29 = (st_ptls_early_data_receiver_t *)malloc(0x40);
        (tls->field_7).server.early_data = psVar29;
        if (psVar29 == (st_ptls_early_data_receiver_t *)0x0) {
          iVar20 = 0x201;
        }
        else {
          iVar20 = setup_traffic_protection(tls,tls->cipher_suite,0,"client early traffic secret");
          if (iVar20 == 0) goto LAB_0010a36c;
        }
      }
    }
LAB_00109c23:
    free(pubkey.base);
    free(ecdh_secret.base);
    psVar52 = (st_ptls_server_hello_t *)finished_key;
LAB_00109c4c:
    (*ptls_clear_memory)(psVar52,0x40);
    return iVar20;
  case PTLS_STATE_SERVER_EXPECT_FINISHED:
    if (uVar4 != '\x14') {
      return 0x28;
    }
    iVar19 = verify_finished(tls,message);
    if (iVar19 != 0) {
      return iVar19;
    }
    iVar19 = setup_traffic_protection(tls,tls->cipher_suite,0,"client application traffic secret");
    if (iVar19 != 0) {
      return iVar19;
    }
    psVar5 = tls->key_schedule->msghash;
    (*psVar5->update)(psVar5,puVar40,uVar44);
    if (tls->ctx->ticket_lifetime != 0) {
      paVar1 = &(tls->field_7).server;
      *(byte *)paVar1 = *(byte *)paVar1 | 1;
    }
    tls->state = PTLS_STATE_SERVER_POST_HANDSHAKE;
    goto LAB_00109ec8;
  case PTLS_STATE_CLIENT_POST_HANDSHAKE:
    if (uVar4 != '\x04') {
      return 10;
    }
    iVar19 = decode_new_session_ticket
                       ((uint32_t *)finished_key,(uint32_t *)binder_key,(ptls_iovec_t *)&sh,
                        &max_early_data_size,puVar40 + 4,puVar40 + uVar44);
    if (iVar19 != 0) {
      return iVar19;
    }
    if (tls->ctx->save_ticket != (ptls_save_ticket_t *)0x0) {
      finished_key[0x10] = '\0';
      finished_key[0x11] = '\0';
      finished_key[0x12] = '\0';
      finished_key[0x13] = '\0';
      finished_key[0x14] = '\0';
      finished_key[0x15] = '\0';
      finished_key[0x16] = '\0';
      finished_key[0x17] = '\0';
      finished_key[8] = '\0';
      finished_key[9] = '\x02';
      finished_key[10] = '\0';
      finished_key[0xb] = '\0';
      finished_key[0xc] = '\0';
      finished_key[0xd] = '\0';
      finished_key[0xe] = '\0';
      finished_key[0xf] = '\0';
      finished_key._24_8_ = (ulong)(uint)finished_key._28_4_ << 0x20;
      finished_key._0_8_ = &sh;
      gettimeofday((timeval *)binder_key,(__timezone_ptr_t)0x0);
      iVar19 = ptls_buffer_reserve((ptls_buffer_t *)finished_key,8);
      if (iVar19 == 0) {
        uVar23 = binder_key._0_8_ * 1000 + (long)binder_key._8_8_ / 1000;
        *(ulong *)(finished_key._0_8_ + finished_key._16_8_) =
             uVar23 >> 0x38 | (uVar23 & 0xff000000000000) >> 0x28 |
             (uVar23 & 0xff0000000000) >> 0x18 | (uVar23 & 0xff00000000) >> 8 |
             (uVar23 & 0xff000000) << 8 | (uVar23 & 0xff0000) << 0x18 | (uVar23 & 0xff00) << 0x28 |
             uVar23 << 0x38;
        finished_key._16_8_ = finished_key._16_8_ + 8;
        iVar19 = 0;
      }
      if (iVar19 == 0) {
        uVar34 = tls->cipher_suite->id;
        iVar19 = ptls_buffer_reserve((ptls_buffer_t *)finished_key,2);
        if (iVar19 == 0) {
          *(ushort *)(finished_key._0_8_ + finished_key._16_8_) = uVar34 << 8 | uVar34 >> 8;
          finished_key._16_8_ = finished_key._16_8_ + 2;
          iVar19 = 0;
        }
        if (iVar19 == 0) {
          iVar19 = ptls_buffer_reserve((ptls_buffer_t *)finished_key,3);
          if (iVar19 == 0) {
            *(undefined1 *)(finished_key._0_8_ + 2 + finished_key._16_8_) = 0;
            *(undefined2 *)(finished_key._0_8_ + finished_key._16_8_) = 0;
            finished_key._16_8_ = finished_key._16_8_ + 3;
            iVar19 = 0;
          }
          uVar16 = finished_key._16_8_;
          iVar20 = 6;
          if ((iVar19 == 0) &&
             (iVar19 = ptls_buffer__do_pushv((ptls_buffer_t *)finished_key,puVar40 + 4,uVar44 - 4),
             iVar19 == 0)) {
            puVar43 = (undefined1 *)(finished_key._0_8_ + uVar16 + -3);
            lVar38 = 0x10;
            do {
              *puVar43 = (char)((ulong)(finished_key._16_8_ - uVar16) >> ((byte)lVar38 & 0x3f));
              lVar38 = lVar38 + -8;
              puVar43 = puVar43 + 1;
            } while (lVar38 != -8);
            iVar20 = 0;
          }
          if (iVar20 != 6) {
            if (iVar20 != 0) {
              return 0;
            }
            iVar19 = ptls_buffer_reserve((ptls_buffer_t *)finished_key,2);
            if (iVar19 == 0) {
              *(undefined2 *)(finished_key._0_8_ + finished_key._16_8_) = 0;
              finished_key._16_8_ = finished_key._16_8_ + 2;
              iVar19 = 0;
            }
            uVar16 = finished_key._16_8_;
            iVar20 = 6;
            if (((iVar19 == 0) &&
                (iVar19 = ptls_buffer_reserve((ptls_buffer_t *)finished_key,
                                              tls->key_schedule->algo->digest_size),
                uVar18 = finished_key._16_8_, uVar17 = finished_key._0_8_, iVar19 == 0)) &&
               (iVar19 = derive_secret(tls->key_schedule,
                                       (void *)(finished_key._16_8_ + finished_key._0_8_),
                                       "resumption master secret"), iVar19 == 0)) {
              finished_key._16_8_ = uVar18 + tls->key_schedule->algo->digest_size;
              puVar43 = (undefined1 *)(uVar16 + uVar17 + -2);
              lVar38 = 8;
              do {
                *puVar43 = (char)((ulong)(finished_key._16_8_ - uVar16) >> ((byte)lVar38 & 0x3f));
                lVar38 = lVar38 + -8;
                puVar43 = puVar43 + 1;
              } while (lVar38 != -8);
              iVar20 = 0;
              iVar19 = 0;
            }
            if (iVar20 != 6) {
              if (iVar20 != 0) {
                return 0;
              }
              psVar10 = tls->ctx->save_ticket;
              pVar67.len._0_1_ = finished_key[0x10];
              pVar67.len._1_1_ = finished_key[0x11];
              pVar67.len._2_1_ = finished_key[0x12];
              pVar67.len._3_1_ = finished_key[0x13];
              pVar67.len._4_1_ = finished_key[0x14];
              pVar67.len._5_1_ = finished_key[0x15];
              pVar67.len._6_1_ = finished_key[0x16];
              pVar67.len._7_1_ = finished_key[0x17];
              pVar67.base = (uint8_t *)finished_key._0_8_;
              iVar19 = (*psVar10->cb)(psVar10,tls,pVar67);
            }
          }
        }
      }
      uVar16 = finished_key._0_8_;
      (*ptls_clear_memory)((void *)finished_key._0_8_,finished_key._16_8_);
      if (finished_key._24_4_ == 0) {
        return iVar19;
      }
      free((void *)uVar16);
      return iVar19;
    }
LAB_00109ec8:
    aVar63 = PTLS_STATE_CLIENT_HANDSHAKE_START;
  case PTLS_STATE_SERVER_POST_HANDSHAKE:
    goto switchD_0010956e_caseD_a;
  }
  aVar63 = 0x202;
switchD_0010956e_caseD_a:
  return aVar63;
}

Assistant:

static int handle_handshake_message(ptls_t *tls, ptls_buffer_t *sendbuf, ptls_iovec_t message,
                                    ptls_handshake_properties_t *properties)
{
    uint8_t type = message.base[0];
    int ret;

    switch (tls->state) {
    case PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO:
        if (type == PTLS_HANDSHAKE_TYPE_SERVER_HELLO) {
            ret = client_handle_hello(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS:
        if (type == PTLS_HANDSHAKE_TYPE_ENCRYPTED_EXTENSIONS) {
            ret = client_handle_encrypted_extensions(tls, message, properties);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE) {
            ret = client_handle_certificate(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY) {
            ret = client_handle_certificate_verify(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_FINISHED:
        if (type == PTLS_HANDSHAKE_TYPE_FINISHED) {
            ret = client_handle_finished(tls, sendbuf, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO:
        if (type == PTLS_HANDSHAKE_TYPE_CLIENT_HELLO) {
            ret = server_handle_hello(tls, sendbuf, message);
        } else {
            ret = PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_FINISHED:
        if (type == PTLS_HANDSHAKE_TYPE_FINISHED) {
            ret = server_handle_finished(tls, message);
        } else {
            ret = PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        break;
    case PTLS_STATE_CLIENT_POST_HANDSHAKE:
        switch (type) {
        case PTLS_HANDSHAKE_TYPE_NEW_SESSION_TICKET:
            ret = client_handle_new_session_ticket(tls, message);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
        break;
    case PTLS_STATE_SERVER_POST_HANDSHAKE:
        ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        break;
    default:
        assert(!"unexpected state");
        break;
    }

    return ret;
}